

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImGuiWindow **ppIVar1;
  int *piVar2;
  ImS8 *pIVar3;
  float *pfVar4;
  ImRect *pIVar5;
  ImVec2 *pIVar6;
  ImU16 *pIVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  double dVar11;
  ImGuiNavLayer IVar12;
  ImGuiContextHook *pIVar13;
  char *pcVar14;
  uint *puVar15;
  ImGuiViewportP *pIVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  ImGuiTableTempData *pIVar19;
  ImGuiWindowStackData *pIVar20;
  ImGuiPopupData *pIVar21;
  ImGuiGroupData *pIVar22;
  ImGuiStackLevelInfo *pIVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  ImRect IVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  ulong uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  ImGuiContext *pIVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  uint uVar47;
  ImGuiID IVar48;
  uint uVar49;
  ImGuiNavLayer layer;
  ImGuiContext *ctx;
  ulong uVar50;
  uint *__dest;
  ImGuiWindow *pIVar51;
  ImGuiContext *pIVar52;
  ImGuiWindowStackData *__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar53;
  int *piVar54;
  ImGuiGroupData *__dest_02;
  ImGuiStackLevelInfo *__dest_03;
  byte bVar55;
  int i;
  ImGuiID IVar56;
  ImGuiInputSource IVar57;
  ImGuiDir IVar58;
  ImGuiScrollFlags scroll_flags;
  ImGuiWindow *pIVar59;
  ImGuiWindow *window;
  int iVar60;
  ImGuiNavMoveFlags move_flags;
  ImGuiContext *g;
  int iVar61;
  ImGuiDir IVar62;
  ImFont *font;
  bool *pbVar63;
  ImGuiWindow *old_nav_window;
  ImGuiContext *g_1;
  long lVar64;
  long lVar65;
  ImGuiContext *pIVar66;
  ImGuiContext *g_2;
  ulong uVar67;
  ImGuiContext *pIVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  byte bVar72;
  ushort uVar73;
  float fVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [48];
  undefined1 auVar86 [64];
  float fVar88;
  ImVec4 IVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar89;
  float fVar90;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [64];
  undefined1 extraout_var [56];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 local_88 [16];
  undefined1 local_68 [16];
  ImVec2 local_38;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  pIVar43 = GImGui;
  uVar50 = (ulong)(GImGui->Hooks).Size;
  if (0 < (long)uVar50) {
    lVar64 = -uVar50;
    uVar67 = uVar50 + 1;
    lVar65 = uVar50 << 5;
    do {
      pIVar13 = (pIVar43->Hooks).Data;
      if (*(int *)(pIVar13 + lVar65 + -0x1c) == 7) {
        memmove(pIVar13 + lVar65 + -0x20,pIVar13 + lVar65,((int)uVar50 + lVar64) * 0x20);
        uVar47 = (pIVar43->Hooks).Size - 1;
        uVar50 = (ulong)uVar47;
        (pIVar43->Hooks).Size = uVar47;
      }
      lVar64 = lVar64 + 1;
      uVar67 = uVar67 - 1;
      lVar65 = lVar65 + -0x20;
    } while (1 < uVar67);
    if (0 < (int)uVar50) {
      lVar65 = 0;
      lVar64 = 0;
      do {
        pIVar13 = (pIVar43->Hooks).Data;
        if (*(int *)(pIVar13 + lVar65 + 4) == 0) {
          (**(code **)(pIVar13 + lVar65 + 0x10))(pIVar43,pIVar13 + lVar65);
          uVar50 = (ulong)(uint)(pIVar43->Hooks).Size;
        }
        lVar64 = lVar64 + 1;
        lVar65 = lVar65 + 0x20;
      } while (lVar64 < (int)uVar50);
    }
  }
  pIVar68 = GImGui;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar68->SettingsLoaded == false) {
    pcVar14 = (pIVar68->IO).IniFilename;
    if (pcVar14 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar14);
    }
    pIVar68->SettingsLoaded = true;
  }
  if ((0.0 < pIVar68->SettingsDirtyTimer) &&
     (fVar88 = pIVar68->SettingsDirtyTimer - (pIVar68->IO).DeltaTime,
     pIVar68->SettingsDirtyTimer = fVar88, fVar88 <= 0.0)) {
    pcVar14 = (pIVar68->IO).IniFilename;
    if (pcVar14 == (char *)0x0) {
      (pIVar68->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar14);
    }
    pIVar68->SettingsDirtyTimer = 0.0;
  }
  fVar88 = (pIVar43->IO).DeltaTime;
  pIVar43->Time = (double)fVar88 + pIVar43->Time;
  pIVar43->WithinFrameScope = true;
  pIVar43->FrameCount = pIVar43->FrameCount + 1;
  pIVar43->TooltipOverrideCount = 0;
  pIVar43->WindowsActiveCount = 0;
  if ((pIVar43->MenusIdSubmittedThisFrame).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar54 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar54 = *piVar54 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    puVar15 = (pIVar43->MenusIdSubmittedThisFrame).Data;
    if (puVar15 != (uint *)0x0) {
      memcpy(__dest,puVar15,(long)(pIVar43->MenusIdSubmittedThisFrame).Size << 2);
      puVar15 = (pIVar43->MenusIdSubmittedThisFrame).Data;
      if ((puVar15 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar54 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar54 = *piVar54 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar15,GImAllocatorUserData);
    }
    (pIVar43->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar43->MenusIdSubmittedThisFrame).Capacity = 0;
    fVar88 = (pIVar43->IO).DeltaTime;
  }
  pIVar68 = GImGui;
  (pIVar43->MenusIdSubmittedThisFrame).Size = 0;
  iVar61 = pIVar43->FramerateSecPerFrameIdx;
  pIVar43->FramerateSecPerFrameAccum =
       (fVar88 - pIVar43->FramerateSecPerFrame[iVar61]) + pIVar43->FramerateSecPerFrameAccum;
  pIVar43->FramerateSecPerFrame[iVar61] = fVar88;
  iVar60 = (int)((ulong)((long)(iVar61 + 1) * -0x77777777) >> 0x20) + 1 + iVar61;
  pIVar43->FramerateSecPerFrameIdx = iVar61 + 1 + ((iVar60 >> 6) - (iVar60 >> 0x1f)) * -0x78;
  iVar61 = 0x77;
  if (pIVar43->FramerateSecPerFrameCount < 0x77) {
    iVar61 = pIVar43->FramerateSecPerFrameCount;
  }
  pIVar43->FramerateSecPerFrameCount = iVar61 + 1;
  auVar76._0_12_ = ZEXT812(0);
  auVar76._12_4_ = 0;
  uVar36 = vcmpss_avx512f(auVar76,ZEXT416((uint)pIVar43->FramerateSecPerFrameAccum),1);
  bVar71 = (bool)((byte)uVar36 & 1);
  fVar88 = 3.4028235e+38;
  (pIVar43->IO).Framerate =
       (float)((uint)bVar71 *
               (int)(1.0 / (pIVar43->FramerateSecPerFrameAccum / (float)(iVar61 + 1))) +
              (uint)!bVar71 * 0x7f7fffff);
  pIVar16 = *(pIVar68->Viewports).Data;
  (pIVar16->super_ImGuiViewport).Flags = 5;
  (pIVar16->super_ImGuiViewport).Pos.x = 0.0;
  (pIVar16->super_ImGuiViewport).Pos.y = 0.0;
  (pIVar16->super_ImGuiViewport).Size = (pIVar68->IO).DisplaySize;
  if (0 < (pIVar68->Viewports).Size) {
    auVar77._0_12_ = ZEXT812(0);
    auVar77._12_4_ = 0;
    lVar65 = 0;
    do {
      pIVar16 = (pIVar68->Viewports).Data[lVar65];
      lVar65 = lVar65 + 1;
      IVar17 = pIVar16->BuildWorkOffsetMin;
      pIVar16->WorkOffsetMin = IVar17;
      IVar18 = pIVar16->BuildWorkOffsetMax;
      pIVar16->WorkOffsetMax = IVar18;
      (pIVar16->BuildWorkOffsetMin).x = (float)(int)auVar77._0_8_;
      (pIVar16->BuildWorkOffsetMin).y = (float)(int)((ulong)auVar77._0_8_ >> 0x20);
      (pIVar16->BuildWorkOffsetMax).x = (float)(int)auVar77._8_8_;
      (pIVar16->BuildWorkOffsetMax).y = (float)(int)((ulong)auVar77._8_8_ >> 0x20);
      IVar10 = (pIVar16->super_ImGuiViewport).Pos;
      auVar129._8_8_ = 0;
      auVar129._0_4_ = (pIVar16->super_ImGuiViewport).Size.x;
      auVar129._4_4_ = (pIVar16->super_ImGuiViewport).Size.y;
      auVar114._8_8_ = 0;
      auVar114._0_4_ = IVar17.x;
      auVar114._4_4_ = IVar17.y;
      auVar122._0_4_ = IVar10.x + IVar17.x;
      auVar122._4_4_ = IVar10.y + IVar17.y;
      auVar122._8_8_ = 0;
      auVar76 = vsubps_avx(auVar129,auVar114);
      auVar115._0_4_ = auVar76._0_4_ + IVar18.x;
      auVar115._4_4_ = auVar76._4_4_ + IVar18.y;
      auVar115._8_4_ = auVar76._8_4_ + 0.0;
      auVar115._12_4_ = auVar76._12_4_ + 0.0;
      uVar50 = vcmpps_avx512vl(auVar115,auVar77,6);
      auVar75._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * (int)auVar115._4_4_;
      auVar75._0_4_ = (uint)((byte)uVar50 & 1) * (int)auVar115._0_4_;
      auVar75._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * (int)auVar115._8_4_;
      auVar75._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * (int)auVar115._12_4_;
      auVar76 = vmovlhps_avx(auVar122,auVar75);
      (pIVar16->super_ImGuiViewport).WorkPos.x = (float)(int)auVar76._0_8_;
      (pIVar16->super_ImGuiViewport).WorkPos.y = (float)(int)((ulong)auVar76._0_8_ >> 0x20);
      (pIVar16->super_ImGuiViewport).WorkSize.x = (float)(int)auVar76._8_8_;
      (pIVar16->super_ImGuiViewport).WorkSize.y = (float)(int)((ulong)auVar76._8_8_ >> 0x20);
    } while (lVar65 < (pIVar68->Viewports).Size);
  }
  ((pIVar43->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  lVar65 = (long)(pIVar43->Viewports).Size;
  IVar91 = _DAT_005432a0;
  if (0 < lVar65) {
    auVar111 = ZEXT1664((undefined1  [16])_DAT_005432a0);
    lVar64 = 0;
    do {
      pIVar16 = (pIVar43->Viewports).Data[lVar64];
      fVar74 = (pIVar16->super_ImGuiViewport).Pos.x;
      if (fVar74 < auVar111._0_4_) {
        auVar111 = ZEXT1664(CONCAT124(auVar111._4_12_,fVar74));
      }
      fVar89 = (pIVar16->super_ImGuiViewport).Pos.y;
      auVar76 = vmovshdup_avx(auVar111._0_16_);
      if (fVar89 < auVar76._0_4_) {
        auVar76 = vinsertps_avx(auVar111._0_16_,ZEXT416((uint)fVar89),0x10);
        auVar111 = ZEXT1664(auVar76);
      }
      fVar74 = fVar74 + (pIVar16->super_ImGuiViewport).Size.x;
      auVar77 = auVar111._0_16_;
      auVar76 = vshufpd_avx(auVar77,auVar77,1);
      if (auVar76._0_4_ < fVar74) {
        auVar76 = vinsertps_avx(auVar77,ZEXT416((uint)fVar74),0x20);
        auVar111 = ZEXT1664(auVar76);
      }
      fVar89 = fVar89 + (pIVar16->super_ImGuiViewport).Size.y;
      auVar77 = auVar111._0_16_;
      auVar76 = vshufps_avx(auVar77,auVar77,0xff);
      if (auVar76._0_4_ < fVar89) {
        auVar76 = vinsertps_avx(auVar77,ZEXT416((uint)fVar89),0x30);
        auVar111 = ZEXT1664(auVar76);
      }
      IVar91 = auVar111._0_16_;
      lVar64 = lVar64 + 1;
    } while (lVar65 != lVar64);
  }
  (pIVar43->DrawListSharedData).ClipRectFullscreen = IVar91;
  fVar74 = (pIVar43->Style).CircleTessellationMaxError;
  (pIVar43->DrawListSharedData).CurveTessellationTol = (pIVar43->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar43->DrawListSharedData,fVar74);
  bVar71 = (pIVar43->Style).AntiAliasedLines;
  uVar47 = (uint)bVar71;
  (pIVar43->DrawListSharedData).InitialFlags = (uint)bVar71;
  if (((pIVar43->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar43->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar47 = bVar71 | 2;
    (pIVar43->DrawListSharedData).InitialFlags = uVar47;
  }
  if ((pIVar43->Style).AntiAliasedFill == true) {
    uVar47 = uVar47 | 4;
    (pIVar43->DrawListSharedData).InitialFlags = uVar47;
  }
  if (((pIVar43->IO).BackendFlags & 8) != 0) {
    (pIVar43->DrawListSharedData).InitialFlags = uVar47 | 8;
  }
  if (0 < (pIVar43->Viewports).Size) {
    lVar65 = 0;
    do {
      pIVar16 = (pIVar43->Viewports).Data[lVar65];
      lVar65 = lVar65 + 1;
      (pIVar16->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar16->DrawDataP).DisplayPos.x = 0.0;
      (pIVar16->DrawDataP).DisplayPos.y = 0.0;
      (pIVar16->DrawDataP).DisplaySize.x = 0.0;
      (pIVar16->DrawDataP).DisplaySize.y = 0.0;
      (pIVar16->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar16->DrawDataP).FramebufferScale.y = 0.0;
      (pIVar16->DrawDataP).Valid = false;
      *(undefined3 *)&(pIVar16->DrawDataP).field_0x1 = 0;
      (pIVar16->DrawDataP).CmdListsCount = 0;
      (pIVar16->DrawDataP).TotalIdxCount = 0;
      (pIVar16->DrawDataP).TotalVtxCount = 0;
      (pIVar16->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar16->DrawDataP).DisplayPos.x = 0.0;
      (pIVar16->DrawDataP).DisplayPos.y = 0.0;
    } while (lVar65 < (pIVar43->Viewports).Size);
  }
  pIVar68 = GImGui;
  if ((pIVar43->DragDropActive != false) &&
     (IVar56 = (pIVar43->DragDropPayload).SourceId, IVar56 == pIVar43->ActiveId)) {
    if (GImGui->ActiveId == IVar56) {
      GImGui->ActiveIdIsAlive = IVar56;
    }
    if (pIVar68->ActiveIdPreviousFrame == IVar56) {
      pIVar68->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar43->HoveredIdPreviousFrame == 0) {
    IVar56 = pIVar43->HoveredId;
    pIVar43->HoveredIdTimer = 0.0;
    pIVar43->HoveredIdNotActiveTimer = 0.0;
    if (IVar56 == 0) goto LAB_002b2f94;
LAB_002b2f71:
    fVar74 = (pIVar43->IO).DeltaTime;
    pIVar43->HoveredIdTimer = fVar74 + pIVar43->HoveredIdTimer;
    IVar48 = IVar56;
    if (pIVar43->ActiveId != IVar56) {
      pIVar43->HoveredIdNotActiveTimer = fVar74 + pIVar43->HoveredIdNotActiveTimer;
      IVar48 = pIVar43->ActiveId;
    }
  }
  else {
    IVar56 = pIVar43->HoveredId;
    if (IVar56 != 0) {
      if (pIVar43->ActiveId == IVar56) {
        pIVar43->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_002b2f71;
    }
LAB_002b2f94:
    IVar56 = 0;
    IVar48 = pIVar43->ActiveId;
  }
  pIVar43->HoveredIdPreviousFrame = IVar56;
  pIVar43->HoveredIdPreviousFrameUsingMouseWheel = pIVar43->HoveredIdUsingMouseWheel;
  pIVar43->HoveredId = 0;
  pIVar43->HoveredIdAllowOverlap = false;
  pIVar43->HoveredIdUsingMouseWheel = false;
  pIVar43->HoveredIdDisabled = false;
  if (((pIVar43->ActiveIdIsAlive != IVar48) && (IVar48 != 0)) &&
     (pIVar43->ActiveIdPreviousFrame == IVar48)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar48 = pIVar43->ActiveId;
  }
  fVar74 = (pIVar43->IO).DeltaTime;
  if (IVar48 != 0) {
    pIVar43->ActiveIdTimer = fVar74 + pIVar43->ActiveIdTimer;
  }
  pIVar43->LastActiveIdTimer = fVar74 + pIVar43->LastActiveIdTimer;
  pIVar43->ActiveIdPreviousFrame = IVar48;
  pIVar43->ActiveIdPreviousFrameWindow = pIVar43->ActiveIdWindow;
  pIVar43->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar43->ActiveIdHasBeenEditedBefore;
  pIVar43->ActiveIdIsAlive = 0;
  pIVar43->ActiveIdHasBeenEditedThisFrame = false;
  pIVar43->ActiveIdPreviousFrameIsAlive = false;
  pIVar43->ActiveIdIsJustActivated = false;
  if (pIVar43->TempInputId == 0) {
LAB_002b307f:
    if (IVar48 == 0) {
      auVar92._0_12_ = ZEXT812(0);
      auVar92._12_4_ = 0;
      pIVar43->ActiveIdUsingNavDirMask = auVar92._0_4_;
      pIVar43->ActiveIdUsingNavInputMask = auVar92._4_4_;
      pIVar43->ActiveIdUsingKeyInputMask = auVar92._8_8_;
    }
  }
  else if (IVar48 != pIVar43->TempInputId) {
    pIVar43->TempInputId = 0;
    goto LAB_002b307f;
  }
  pIVar43->DragDropAcceptIdPrev = pIVar43->DragDropAcceptIdCurr;
  pIVar43->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar43->DragDropAcceptIdCurr = 0;
  pIVar43->DragDropWithinSource = false;
  pIVar43->DragDropWithinTarget = false;
  pIVar43->DragDropHoldJustPressedId = 0;
  if ((pIVar43->IO).AppFocusLost == true) {
    lVar65 = -0x200;
    (pIVar43->IO).KeysDown[0x1c0] = false;
    (pIVar43->IO).KeysDown[0x1c1] = false;
    (pIVar43->IO).KeysDown[0x1c2] = false;
    (pIVar43->IO).KeysDown[0x1c3] = false;
    (pIVar43->IO).KeysDown[0x1c4] = false;
    (pIVar43->IO).KeysDown[0x1c5] = false;
    (pIVar43->IO).KeysDown[0x1c6] = false;
    (pIVar43->IO).KeysDown[0x1c7] = false;
    (pIVar43->IO).KeysDown[0x1c8] = false;
    (pIVar43->IO).KeysDown[0x1c9] = false;
    (pIVar43->IO).KeysDown[0x1ca] = false;
    (pIVar43->IO).KeysDown[0x1cb] = false;
    (pIVar43->IO).KeysDown[0x1cc] = false;
    (pIVar43->IO).KeysDown[0x1cd] = false;
    (pIVar43->IO).KeysDown[0x1ce] = false;
    (pIVar43->IO).KeysDown[0x1cf] = false;
    (pIVar43->IO).KeysDown[0x1d0] = false;
    (pIVar43->IO).KeysDown[0x1d1] = false;
    (pIVar43->IO).KeysDown[0x1d2] = false;
    (pIVar43->IO).KeysDown[0x1d3] = false;
    (pIVar43->IO).KeysDown[0x1d4] = false;
    (pIVar43->IO).KeysDown[0x1d5] = false;
    (pIVar43->IO).KeysDown[0x1d6] = false;
    (pIVar43->IO).KeysDown[0x1d7] = false;
    (pIVar43->IO).KeysDown[0x1d8] = false;
    (pIVar43->IO).KeysDown[0x1d9] = false;
    (pIVar43->IO).KeysDown[0x1da] = false;
    (pIVar43->IO).KeysDown[0x1db] = false;
    (pIVar43->IO).KeysDown[0x1dc] = false;
    (pIVar43->IO).KeysDown[0x1dd] = false;
    (pIVar43->IO).KeysDown[0x1de] = false;
    (pIVar43->IO).KeysDown[0x1df] = false;
    (pIVar43->IO).KeysDown[0x1e0] = false;
    (pIVar43->IO).KeysDown[0x1e1] = false;
    (pIVar43->IO).KeysDown[0x1e2] = false;
    (pIVar43->IO).KeysDown[0x1e3] = false;
    (pIVar43->IO).KeysDown[0x1e4] = false;
    (pIVar43->IO).KeysDown[0x1e5] = false;
    (pIVar43->IO).KeysDown[0x1e6] = false;
    (pIVar43->IO).KeysDown[0x1e7] = false;
    (pIVar43->IO).KeysDown[0x1e8] = false;
    (pIVar43->IO).KeysDown[0x1e9] = false;
    (pIVar43->IO).KeysDown[0x1ea] = false;
    (pIVar43->IO).KeysDown[0x1eb] = false;
    (pIVar43->IO).KeysDown[0x1ec] = false;
    (pIVar43->IO).KeysDown[0x1ed] = false;
    (pIVar43->IO).KeysDown[0x1ee] = false;
    (pIVar43->IO).KeysDown[0x1ef] = false;
    (pIVar43->IO).KeysDown[0x1f0] = false;
    (pIVar43->IO).KeysDown[0x1f1] = false;
    (pIVar43->IO).KeysDown[0x1f2] = false;
    (pIVar43->IO).KeysDown[499] = false;
    (pIVar43->IO).KeysDown[500] = false;
    (pIVar43->IO).KeysDown[0x1f5] = false;
    (pIVar43->IO).KeysDown[0x1f6] = false;
    (pIVar43->IO).KeysDown[0x1f7] = false;
    (pIVar43->IO).KeysDown[0x1f8] = false;
    (pIVar43->IO).KeysDown[0x1f9] = false;
    (pIVar43->IO).KeysDown[0x1fa] = false;
    (pIVar43->IO).KeysDown[0x1fb] = false;
    (pIVar43->IO).KeysDown[0x1fc] = false;
    (pIVar43->IO).KeysDown[0x1fd] = false;
    (pIVar43->IO).KeysDown[0x1fe] = false;
    (pIVar43->IO).KeysDown[0x1ff] = false;
    (pIVar43->IO).KeysDown[0x180] = false;
    (pIVar43->IO).KeysDown[0x181] = false;
    (pIVar43->IO).KeysDown[0x182] = false;
    (pIVar43->IO).KeysDown[0x183] = false;
    (pIVar43->IO).KeysDown[0x184] = false;
    (pIVar43->IO).KeysDown[0x185] = false;
    (pIVar43->IO).KeysDown[0x186] = false;
    (pIVar43->IO).KeysDown[0x187] = false;
    (pIVar43->IO).KeysDown[0x188] = false;
    (pIVar43->IO).KeysDown[0x189] = false;
    (pIVar43->IO).KeysDown[0x18a] = false;
    (pIVar43->IO).KeysDown[0x18b] = false;
    (pIVar43->IO).KeysDown[0x18c] = false;
    (pIVar43->IO).KeysDown[0x18d] = false;
    (pIVar43->IO).KeysDown[0x18e] = false;
    (pIVar43->IO).KeysDown[399] = false;
    (pIVar43->IO).KeysDown[400] = false;
    (pIVar43->IO).KeysDown[0x191] = false;
    (pIVar43->IO).KeysDown[0x192] = false;
    (pIVar43->IO).KeysDown[0x193] = false;
    (pIVar43->IO).KeysDown[0x194] = false;
    (pIVar43->IO).KeysDown[0x195] = false;
    (pIVar43->IO).KeysDown[0x196] = false;
    (pIVar43->IO).KeysDown[0x197] = false;
    (pIVar43->IO).KeysDown[0x198] = false;
    (pIVar43->IO).KeysDown[0x199] = false;
    (pIVar43->IO).KeysDown[0x19a] = false;
    (pIVar43->IO).KeysDown[0x19b] = false;
    (pIVar43->IO).KeysDown[0x19c] = false;
    (pIVar43->IO).KeysDown[0x19d] = false;
    (pIVar43->IO).KeysDown[0x19e] = false;
    (pIVar43->IO).KeysDown[0x19f] = false;
    (pIVar43->IO).KeysDown[0x1a0] = false;
    (pIVar43->IO).KeysDown[0x1a1] = false;
    (pIVar43->IO).KeysDown[0x1a2] = false;
    (pIVar43->IO).KeysDown[0x1a3] = false;
    (pIVar43->IO).KeysDown[0x1a4] = false;
    (pIVar43->IO).KeysDown[0x1a5] = false;
    (pIVar43->IO).KeysDown[0x1a6] = false;
    (pIVar43->IO).KeysDown[0x1a7] = false;
    (pIVar43->IO).KeysDown[0x1a8] = false;
    (pIVar43->IO).KeysDown[0x1a9] = false;
    (pIVar43->IO).KeysDown[0x1aa] = false;
    (pIVar43->IO).KeysDown[0x1ab] = false;
    (pIVar43->IO).KeysDown[0x1ac] = false;
    (pIVar43->IO).KeysDown[0x1ad] = false;
    (pIVar43->IO).KeysDown[0x1ae] = false;
    (pIVar43->IO).KeysDown[0x1af] = false;
    (pIVar43->IO).KeysDown[0x1b0] = false;
    (pIVar43->IO).KeysDown[0x1b1] = false;
    (pIVar43->IO).KeysDown[0x1b2] = false;
    (pIVar43->IO).KeysDown[0x1b3] = false;
    (pIVar43->IO).KeysDown[0x1b4] = false;
    (pIVar43->IO).KeysDown[0x1b5] = false;
    (pIVar43->IO).KeysDown[0x1b6] = false;
    (pIVar43->IO).KeysDown[0x1b7] = false;
    (pIVar43->IO).KeysDown[0x1b8] = false;
    (pIVar43->IO).KeysDown[0x1b9] = false;
    (pIVar43->IO).KeysDown[0x1ba] = false;
    (pIVar43->IO).KeysDown[0x1bb] = false;
    (pIVar43->IO).KeysDown[0x1bc] = false;
    (pIVar43->IO).KeysDown[0x1bd] = false;
    (pIVar43->IO).KeysDown[0x1be] = false;
    (pIVar43->IO).KeysDown[0x1bf] = false;
    (pIVar43->IO).KeysDown[0x140] = false;
    (pIVar43->IO).KeysDown[0x141] = false;
    (pIVar43->IO).KeysDown[0x142] = false;
    (pIVar43->IO).KeysDown[0x143] = false;
    (pIVar43->IO).KeysDown[0x144] = false;
    (pIVar43->IO).KeysDown[0x145] = false;
    (pIVar43->IO).KeysDown[0x146] = false;
    (pIVar43->IO).KeysDown[0x147] = false;
    (pIVar43->IO).KeysDown[0x148] = false;
    (pIVar43->IO).KeysDown[0x149] = false;
    (pIVar43->IO).KeysDown[0x14a] = false;
    (pIVar43->IO).KeysDown[0x14b] = false;
    (pIVar43->IO).KeysDown[0x14c] = false;
    (pIVar43->IO).KeysDown[0x14d] = false;
    (pIVar43->IO).KeysDown[0x14e] = false;
    (pIVar43->IO).KeysDown[0x14f] = false;
    (pIVar43->IO).KeysDown[0x150] = false;
    (pIVar43->IO).KeysDown[0x151] = false;
    (pIVar43->IO).KeysDown[0x152] = false;
    (pIVar43->IO).KeysDown[0x153] = false;
    (pIVar43->IO).KeysDown[0x154] = false;
    (pIVar43->IO).KeysDown[0x155] = false;
    (pIVar43->IO).KeysDown[0x156] = false;
    (pIVar43->IO).KeysDown[0x157] = false;
    (pIVar43->IO).KeysDown[0x158] = false;
    (pIVar43->IO).KeysDown[0x159] = false;
    (pIVar43->IO).KeysDown[0x15a] = false;
    (pIVar43->IO).KeysDown[0x15b] = false;
    (pIVar43->IO).KeysDown[0x15c] = false;
    (pIVar43->IO).KeysDown[0x15d] = false;
    (pIVar43->IO).KeysDown[0x15e] = false;
    (pIVar43->IO).KeysDown[0x15f] = false;
    (pIVar43->IO).KeysDown[0x160] = false;
    (pIVar43->IO).KeysDown[0x161] = false;
    (pIVar43->IO).KeysDown[0x162] = false;
    (pIVar43->IO).KeysDown[0x163] = false;
    (pIVar43->IO).KeysDown[0x164] = false;
    (pIVar43->IO).KeysDown[0x165] = false;
    (pIVar43->IO).KeysDown[0x166] = false;
    (pIVar43->IO).KeysDown[0x167] = false;
    (pIVar43->IO).KeysDown[0x168] = false;
    (pIVar43->IO).KeysDown[0x169] = false;
    (pIVar43->IO).KeysDown[0x16a] = false;
    (pIVar43->IO).KeysDown[0x16b] = false;
    (pIVar43->IO).KeysDown[0x16c] = false;
    (pIVar43->IO).KeysDown[0x16d] = false;
    (pIVar43->IO).KeysDown[0x16e] = false;
    (pIVar43->IO).KeysDown[0x16f] = false;
    (pIVar43->IO).KeysDown[0x170] = false;
    (pIVar43->IO).KeysDown[0x171] = false;
    (pIVar43->IO).KeysDown[0x172] = false;
    (pIVar43->IO).KeysDown[0x173] = false;
    (pIVar43->IO).KeysDown[0x174] = false;
    (pIVar43->IO).KeysDown[0x175] = false;
    (pIVar43->IO).KeysDown[0x176] = false;
    (pIVar43->IO).KeysDown[0x177] = false;
    (pIVar43->IO).KeysDown[0x178] = false;
    (pIVar43->IO).KeysDown[0x179] = false;
    (pIVar43->IO).KeysDown[0x17a] = false;
    (pIVar43->IO).KeysDown[0x17b] = false;
    (pIVar43->IO).KeysDown[0x17c] = false;
    (pIVar43->IO).KeysDown[0x17d] = false;
    (pIVar43->IO).KeysDown[0x17e] = false;
    (pIVar43->IO).KeysDown[0x17f] = false;
    (pIVar43->IO).KeysDown[0x100] = false;
    (pIVar43->IO).KeysDown[0x101] = false;
    (pIVar43->IO).KeysDown[0x102] = false;
    (pIVar43->IO).KeysDown[0x103] = false;
    (pIVar43->IO).KeysDown[0x104] = false;
    (pIVar43->IO).KeysDown[0x105] = false;
    (pIVar43->IO).KeysDown[0x106] = false;
    (pIVar43->IO).KeysDown[0x107] = false;
    (pIVar43->IO).KeysDown[0x108] = false;
    (pIVar43->IO).KeysDown[0x109] = false;
    (pIVar43->IO).KeysDown[0x10a] = false;
    (pIVar43->IO).KeysDown[0x10b] = false;
    (pIVar43->IO).KeysDown[0x10c] = false;
    (pIVar43->IO).KeysDown[0x10d] = false;
    (pIVar43->IO).KeysDown[0x10e] = false;
    (pIVar43->IO).KeysDown[0x10f] = false;
    (pIVar43->IO).KeysDown[0x110] = false;
    (pIVar43->IO).KeysDown[0x111] = false;
    (pIVar43->IO).KeysDown[0x112] = false;
    (pIVar43->IO).KeysDown[0x113] = false;
    (pIVar43->IO).KeysDown[0x114] = false;
    (pIVar43->IO).KeysDown[0x115] = false;
    (pIVar43->IO).KeysDown[0x116] = false;
    (pIVar43->IO).KeysDown[0x117] = false;
    (pIVar43->IO).KeysDown[0x118] = false;
    (pIVar43->IO).KeysDown[0x119] = false;
    (pIVar43->IO).KeysDown[0x11a] = false;
    (pIVar43->IO).KeysDown[0x11b] = false;
    (pIVar43->IO).KeysDown[0x11c] = false;
    (pIVar43->IO).KeysDown[0x11d] = false;
    (pIVar43->IO).KeysDown[0x11e] = false;
    (pIVar43->IO).KeysDown[0x11f] = false;
    (pIVar43->IO).KeysDown[0x120] = false;
    (pIVar43->IO).KeysDown[0x121] = false;
    (pIVar43->IO).KeysDown[0x122] = false;
    (pIVar43->IO).KeysDown[0x123] = false;
    (pIVar43->IO).KeysDown[0x124] = false;
    (pIVar43->IO).KeysDown[0x125] = false;
    (pIVar43->IO).KeysDown[0x126] = false;
    (pIVar43->IO).KeysDown[0x127] = false;
    (pIVar43->IO).KeysDown[0x128] = false;
    (pIVar43->IO).KeysDown[0x129] = false;
    (pIVar43->IO).KeysDown[0x12a] = false;
    (pIVar43->IO).KeysDown[299] = false;
    (pIVar43->IO).KeysDown[300] = false;
    (pIVar43->IO).KeysDown[0x12d] = false;
    (pIVar43->IO).KeysDown[0x12e] = false;
    (pIVar43->IO).KeysDown[0x12f] = false;
    (pIVar43->IO).KeysDown[0x130] = false;
    (pIVar43->IO).KeysDown[0x131] = false;
    (pIVar43->IO).KeysDown[0x132] = false;
    (pIVar43->IO).KeysDown[0x133] = false;
    (pIVar43->IO).KeysDown[0x134] = false;
    (pIVar43->IO).KeysDown[0x135] = false;
    (pIVar43->IO).KeysDown[0x136] = false;
    (pIVar43->IO).KeysDown[0x137] = false;
    (pIVar43->IO).KeysDown[0x138] = false;
    (pIVar43->IO).KeysDown[0x139] = false;
    (pIVar43->IO).KeysDown[0x13a] = false;
    (pIVar43->IO).KeysDown[0x13b] = false;
    (pIVar43->IO).KeysDown[0x13c] = false;
    (pIVar43->IO).KeysDown[0x13d] = false;
    (pIVar43->IO).KeysDown[0x13e] = false;
    (pIVar43->IO).KeysDown[0x13f] = false;
    (pIVar43->IO).KeysDown[0xc0] = false;
    (pIVar43->IO).KeysDown[0xc1] = false;
    (pIVar43->IO).KeysDown[0xc2] = false;
    (pIVar43->IO).KeysDown[0xc3] = false;
    (pIVar43->IO).KeysDown[0xc4] = false;
    (pIVar43->IO).KeysDown[0xc5] = false;
    (pIVar43->IO).KeysDown[0xc6] = false;
    (pIVar43->IO).KeysDown[199] = false;
    (pIVar43->IO).KeysDown[200] = false;
    (pIVar43->IO).KeysDown[0xc9] = false;
    (pIVar43->IO).KeysDown[0xca] = false;
    (pIVar43->IO).KeysDown[0xcb] = false;
    (pIVar43->IO).KeysDown[0xcc] = false;
    (pIVar43->IO).KeysDown[0xcd] = false;
    (pIVar43->IO).KeysDown[0xce] = false;
    (pIVar43->IO).KeysDown[0xcf] = false;
    (pIVar43->IO).KeysDown[0xd0] = false;
    (pIVar43->IO).KeysDown[0xd1] = false;
    (pIVar43->IO).KeysDown[0xd2] = false;
    (pIVar43->IO).KeysDown[0xd3] = false;
    (pIVar43->IO).KeysDown[0xd4] = false;
    (pIVar43->IO).KeysDown[0xd5] = false;
    (pIVar43->IO).KeysDown[0xd6] = false;
    (pIVar43->IO).KeysDown[0xd7] = false;
    (pIVar43->IO).KeysDown[0xd8] = false;
    (pIVar43->IO).KeysDown[0xd9] = false;
    (pIVar43->IO).KeysDown[0xda] = false;
    (pIVar43->IO).KeysDown[0xdb] = false;
    (pIVar43->IO).KeysDown[0xdc] = false;
    (pIVar43->IO).KeysDown[0xdd] = false;
    (pIVar43->IO).KeysDown[0xde] = false;
    (pIVar43->IO).KeysDown[0xdf] = false;
    (pIVar43->IO).KeysDown[0xe0] = false;
    (pIVar43->IO).KeysDown[0xe1] = false;
    (pIVar43->IO).KeysDown[0xe2] = false;
    (pIVar43->IO).KeysDown[0xe3] = false;
    (pIVar43->IO).KeysDown[0xe4] = false;
    (pIVar43->IO).KeysDown[0xe5] = false;
    (pIVar43->IO).KeysDown[0xe6] = false;
    (pIVar43->IO).KeysDown[0xe7] = false;
    (pIVar43->IO).KeysDown[0xe8] = false;
    (pIVar43->IO).KeysDown[0xe9] = false;
    (pIVar43->IO).KeysDown[0xea] = false;
    (pIVar43->IO).KeysDown[0xeb] = false;
    (pIVar43->IO).KeysDown[0xec] = false;
    (pIVar43->IO).KeysDown[0xed] = false;
    (pIVar43->IO).KeysDown[0xee] = false;
    (pIVar43->IO).KeysDown[0xef] = false;
    (pIVar43->IO).KeysDown[0xf0] = false;
    (pIVar43->IO).KeysDown[0xf1] = false;
    (pIVar43->IO).KeysDown[0xf2] = false;
    (pIVar43->IO).KeysDown[0xf3] = false;
    (pIVar43->IO).KeysDown[0xf4] = false;
    (pIVar43->IO).KeysDown[0xf5] = false;
    (pIVar43->IO).KeysDown[0xf6] = false;
    (pIVar43->IO).KeysDown[0xf7] = false;
    (pIVar43->IO).KeysDown[0xf8] = false;
    (pIVar43->IO).KeysDown[0xf9] = false;
    (pIVar43->IO).KeysDown[0xfa] = false;
    (pIVar43->IO).KeysDown[0xfb] = false;
    (pIVar43->IO).KeysDown[0xfc] = false;
    (pIVar43->IO).KeysDown[0xfd] = false;
    (pIVar43->IO).KeysDown[0xfe] = false;
    (pIVar43->IO).KeysDown[0xff] = false;
    (pIVar43->IO).KeysDown[0x80] = false;
    (pIVar43->IO).KeysDown[0x81] = false;
    (pIVar43->IO).KeysDown[0x82] = false;
    (pIVar43->IO).KeysDown[0x83] = false;
    (pIVar43->IO).KeysDown[0x84] = false;
    (pIVar43->IO).KeysDown[0x85] = false;
    (pIVar43->IO).KeysDown[0x86] = false;
    (pIVar43->IO).KeysDown[0x87] = false;
    (pIVar43->IO).KeysDown[0x88] = false;
    (pIVar43->IO).KeysDown[0x89] = false;
    (pIVar43->IO).KeysDown[0x8a] = false;
    (pIVar43->IO).KeysDown[0x8b] = false;
    (pIVar43->IO).KeysDown[0x8c] = false;
    (pIVar43->IO).KeysDown[0x8d] = false;
    (pIVar43->IO).KeysDown[0x8e] = false;
    (pIVar43->IO).KeysDown[0x8f] = false;
    (pIVar43->IO).KeysDown[0x90] = false;
    (pIVar43->IO).KeysDown[0x91] = false;
    (pIVar43->IO).KeysDown[0x92] = false;
    (pIVar43->IO).KeysDown[0x93] = false;
    (pIVar43->IO).KeysDown[0x94] = false;
    (pIVar43->IO).KeysDown[0x95] = false;
    (pIVar43->IO).KeysDown[0x96] = false;
    (pIVar43->IO).KeysDown[0x97] = false;
    (pIVar43->IO).KeysDown[0x98] = false;
    (pIVar43->IO).KeysDown[0x99] = false;
    (pIVar43->IO).KeysDown[0x9a] = false;
    (pIVar43->IO).KeysDown[0x9b] = false;
    (pIVar43->IO).KeysDown[0x9c] = false;
    (pIVar43->IO).KeysDown[0x9d] = false;
    (pIVar43->IO).KeysDown[0x9e] = false;
    (pIVar43->IO).KeysDown[0x9f] = false;
    (pIVar43->IO).KeysDown[0xa0] = false;
    (pIVar43->IO).KeysDown[0xa1] = false;
    (pIVar43->IO).KeysDown[0xa2] = false;
    (pIVar43->IO).KeysDown[0xa3] = false;
    (pIVar43->IO).KeysDown[0xa4] = false;
    (pIVar43->IO).KeysDown[0xa5] = false;
    (pIVar43->IO).KeysDown[0xa6] = false;
    (pIVar43->IO).KeysDown[0xa7] = false;
    (pIVar43->IO).KeysDown[0xa8] = false;
    (pIVar43->IO).KeysDown[0xa9] = false;
    (pIVar43->IO).KeysDown[0xaa] = false;
    (pIVar43->IO).KeysDown[0xab] = false;
    (pIVar43->IO).KeysDown[0xac] = false;
    (pIVar43->IO).KeysDown[0xad] = false;
    (pIVar43->IO).KeysDown[0xae] = false;
    (pIVar43->IO).KeysDown[0xaf] = false;
    (pIVar43->IO).KeysDown[0xb0] = false;
    (pIVar43->IO).KeysDown[0xb1] = false;
    (pIVar43->IO).KeysDown[0xb2] = false;
    (pIVar43->IO).KeysDown[0xb3] = false;
    (pIVar43->IO).KeysDown[0xb4] = false;
    (pIVar43->IO).KeysDown[0xb5] = false;
    (pIVar43->IO).KeysDown[0xb6] = false;
    (pIVar43->IO).KeysDown[0xb7] = false;
    (pIVar43->IO).KeysDown[0xb8] = false;
    (pIVar43->IO).KeysDown[0xb9] = false;
    (pIVar43->IO).KeysDown[0xba] = false;
    (pIVar43->IO).KeysDown[0xbb] = false;
    (pIVar43->IO).KeysDown[0xbc] = false;
    (pIVar43->IO).KeysDown[0xbd] = false;
    (pIVar43->IO).KeysDown[0xbe] = false;
    (pIVar43->IO).KeysDown[0xbf] = false;
    (pIVar43->IO).KeysDown[0x40] = false;
    (pIVar43->IO).KeysDown[0x41] = false;
    (pIVar43->IO).KeysDown[0x42] = false;
    (pIVar43->IO).KeysDown[0x43] = false;
    (pIVar43->IO).KeysDown[0x44] = false;
    (pIVar43->IO).KeysDown[0x45] = false;
    (pIVar43->IO).KeysDown[0x46] = false;
    (pIVar43->IO).KeysDown[0x47] = false;
    (pIVar43->IO).KeysDown[0x48] = false;
    (pIVar43->IO).KeysDown[0x49] = false;
    (pIVar43->IO).KeysDown[0x4a] = false;
    (pIVar43->IO).KeysDown[0x4b] = false;
    (pIVar43->IO).KeysDown[0x4c] = false;
    (pIVar43->IO).KeysDown[0x4d] = false;
    (pIVar43->IO).KeysDown[0x4e] = false;
    (pIVar43->IO).KeysDown[0x4f] = false;
    (pIVar43->IO).KeysDown[0x50] = false;
    (pIVar43->IO).KeysDown[0x51] = false;
    (pIVar43->IO).KeysDown[0x52] = false;
    (pIVar43->IO).KeysDown[0x53] = false;
    (pIVar43->IO).KeysDown[0x54] = false;
    (pIVar43->IO).KeysDown[0x55] = false;
    (pIVar43->IO).KeysDown[0x56] = false;
    (pIVar43->IO).KeysDown[0x57] = false;
    (pIVar43->IO).KeysDown[0x58] = false;
    (pIVar43->IO).KeysDown[0x59] = false;
    (pIVar43->IO).KeysDown[0x5a] = false;
    (pIVar43->IO).KeysDown[0x5b] = false;
    (pIVar43->IO).KeysDown[0x5c] = false;
    (pIVar43->IO).KeysDown[0x5d] = false;
    (pIVar43->IO).KeysDown[0x5e] = false;
    (pIVar43->IO).KeysDown[0x5f] = false;
    (pIVar43->IO).KeysDown[0x60] = false;
    (pIVar43->IO).KeysDown[0x61] = false;
    (pIVar43->IO).KeysDown[0x62] = false;
    (pIVar43->IO).KeysDown[99] = false;
    (pIVar43->IO).KeysDown[100] = false;
    (pIVar43->IO).KeysDown[0x65] = false;
    (pIVar43->IO).KeysDown[0x66] = false;
    (pIVar43->IO).KeysDown[0x67] = false;
    (pIVar43->IO).KeysDown[0x68] = false;
    (pIVar43->IO).KeysDown[0x69] = false;
    (pIVar43->IO).KeysDown[0x6a] = false;
    (pIVar43->IO).KeysDown[0x6b] = false;
    (pIVar43->IO).KeysDown[0x6c] = false;
    (pIVar43->IO).KeysDown[0x6d] = false;
    (pIVar43->IO).KeysDown[0x6e] = false;
    (pIVar43->IO).KeysDown[0x6f] = false;
    (pIVar43->IO).KeysDown[0x70] = false;
    (pIVar43->IO).KeysDown[0x71] = false;
    (pIVar43->IO).KeysDown[0x72] = false;
    (pIVar43->IO).KeysDown[0x73] = false;
    (pIVar43->IO).KeysDown[0x74] = false;
    (pIVar43->IO).KeysDown[0x75] = false;
    (pIVar43->IO).KeysDown[0x76] = false;
    (pIVar43->IO).KeysDown[0x77] = false;
    (pIVar43->IO).KeysDown[0x78] = false;
    (pIVar43->IO).KeysDown[0x79] = false;
    (pIVar43->IO).KeysDown[0x7a] = false;
    (pIVar43->IO).KeysDown[0x7b] = false;
    (pIVar43->IO).KeysDown[0x7c] = false;
    (pIVar43->IO).KeysDown[0x7d] = false;
    (pIVar43->IO).KeysDown[0x7e] = false;
    (pIVar43->IO).KeysDown[0x7f] = false;
    (pIVar43->IO).KeysDown[0] = false;
    (pIVar43->IO).KeysDown[1] = false;
    (pIVar43->IO).KeysDown[2] = false;
    (pIVar43->IO).KeysDown[3] = false;
    (pIVar43->IO).KeysDown[4] = false;
    (pIVar43->IO).KeysDown[5] = false;
    (pIVar43->IO).KeysDown[6] = false;
    (pIVar43->IO).KeysDown[7] = false;
    (pIVar43->IO).KeysDown[8] = false;
    (pIVar43->IO).KeysDown[9] = false;
    (pIVar43->IO).KeysDown[10] = false;
    (pIVar43->IO).KeysDown[0xb] = false;
    (pIVar43->IO).KeysDown[0xc] = false;
    (pIVar43->IO).KeysDown[0xd] = false;
    (pIVar43->IO).KeysDown[0xe] = false;
    (pIVar43->IO).KeysDown[0xf] = false;
    (pIVar43->IO).KeysDown[0x10] = false;
    (pIVar43->IO).KeysDown[0x11] = false;
    (pIVar43->IO).KeysDown[0x12] = false;
    (pIVar43->IO).KeysDown[0x13] = false;
    (pIVar43->IO).KeysDown[0x14] = false;
    (pIVar43->IO).KeysDown[0x15] = false;
    (pIVar43->IO).KeysDown[0x16] = false;
    (pIVar43->IO).KeysDown[0x17] = false;
    (pIVar43->IO).KeysDown[0x18] = false;
    (pIVar43->IO).KeysDown[0x19] = false;
    (pIVar43->IO).KeysDown[0x1a] = false;
    (pIVar43->IO).KeysDown[0x1b] = false;
    (pIVar43->IO).KeysDown[0x1c] = false;
    (pIVar43->IO).KeysDown[0x1d] = false;
    (pIVar43->IO).KeysDown[0x1e] = false;
    (pIVar43->IO).KeysDown[0x1f] = false;
    (pIVar43->IO).KeysDown[0x20] = false;
    (pIVar43->IO).KeysDown[0x21] = false;
    (pIVar43->IO).KeysDown[0x22] = false;
    (pIVar43->IO).KeysDown[0x23] = false;
    (pIVar43->IO).KeysDown[0x24] = false;
    (pIVar43->IO).KeysDown[0x25] = false;
    (pIVar43->IO).KeysDown[0x26] = false;
    (pIVar43->IO).KeysDown[0x27] = false;
    (pIVar43->IO).KeysDown[0x28] = false;
    (pIVar43->IO).KeysDown[0x29] = false;
    (pIVar43->IO).KeysDown[0x2a] = false;
    (pIVar43->IO).KeysDown[0x2b] = false;
    (pIVar43->IO).KeysDown[0x2c] = false;
    (pIVar43->IO).KeysDown[0x2d] = false;
    (pIVar43->IO).KeysDown[0x2e] = false;
    (pIVar43->IO).KeysDown[0x2f] = false;
    (pIVar43->IO).KeysDown[0x30] = false;
    (pIVar43->IO).KeysDown[0x31] = false;
    (pIVar43->IO).KeysDown[0x32] = false;
    (pIVar43->IO).KeysDown[0x33] = false;
    (pIVar43->IO).KeysDown[0x34] = false;
    (pIVar43->IO).KeysDown[0x35] = false;
    (pIVar43->IO).KeysDown[0x36] = false;
    (pIVar43->IO).KeysDown[0x37] = false;
    (pIVar43->IO).KeysDown[0x38] = false;
    (pIVar43->IO).KeysDown[0x39] = false;
    (pIVar43->IO).KeysDown[0x3a] = false;
    (pIVar43->IO).KeysDown[0x3b] = false;
    (pIVar43->IO).KeysDown[0x3c] = false;
    (pIVar43->IO).KeysDown[0x3d] = false;
    (pIVar43->IO).KeysDown[0x3e] = false;
    (pIVar43->IO).KeysDown[0x3f] = false;
    auVar111 = vbroadcastss_avx512f(ZEXT416(0xbf800000));
    do {
      *(undefined1 (*) [64])((pIVar43->IO).NavInputsDownDuration + lVar65) = auVar111;
      *(undefined1 (*) [64])((pIVar43->IO).KeysDownDurationPrev + lVar65) = auVar111;
      lVar65 = lVar65 + 0x10;
    } while (lVar65 != 0);
    auVar81 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar82 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar83 = vpbroadcastq_avx512f(ZEXT816(0x14));
    (pIVar43->IO).KeyMods = 0;
    (pIVar43->IO).KeyModsPrev = 0;
    lVar65 = 0;
    (pIVar43->IO).KeyCtrl = false;
    (pIVar43->IO).KeyShift = false;
    (pIVar43->IO).KeyAlt = false;
    (pIVar43->IO).KeySuper = false;
    do {
      auVar84 = vpbroadcastq_avx512f();
      auVar85 = vporq_avx512f(auVar84,auVar81);
      auVar84 = vporq_avx512f(auVar84,auVar82);
      uVar36 = vpcmpuq_avx512f(auVar84,auVar83,1);
      bVar55 = (byte)uVar36;
      uVar36 = vpcmpuq_avx512f(auVar85,auVar83,1);
      bVar72 = (byte)uVar36;
      uVar73 = CONCAT11(bVar72,bVar55);
      pfVar4 = (pIVar43->IO).NavInputsDownDurationPrev + lVar65;
      bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
      bVar69 = (bool)((byte)(uVar73 >> 2) & 1);
      bVar44 = (bool)((byte)(uVar73 >> 3) & 1);
      bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
      bVar45 = (bool)((byte)(uVar73 >> 5) & 1);
      bVar46 = (bool)((byte)(uVar73 >> 6) & 1);
      bVar24 = (bool)((byte)(uVar73 >> 7) & 1);
      bVar25 = (bool)(bVar72 >> 1 & 1);
      bVar26 = (bool)(bVar72 >> 2 & 1);
      bVar27 = (bool)(bVar72 >> 3 & 1);
      bVar28 = (bool)(bVar72 >> 4 & 1);
      bVar29 = (bool)(bVar72 >> 5 & 1);
      bVar30 = (bool)(bVar72 >> 6 & 1);
      *pfVar4 = (float)((uint)(bVar55 & 1) * auVar111._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * (int)*pfVar4);
      pfVar4[1] = (float)((uint)bVar71 * auVar111._4_4_ | (uint)!bVar71 * (int)pfVar4[1]);
      pfVar4[2] = (float)((uint)bVar69 * auVar111._8_4_ | (uint)!bVar69 * (int)pfVar4[2]);
      pfVar4[3] = (float)((uint)bVar44 * auVar111._12_4_ | (uint)!bVar44 * (int)pfVar4[3]);
      pfVar4[4] = (float)((uint)bVar70 * auVar111._16_4_ | (uint)!bVar70 * (int)pfVar4[4]);
      pfVar4[5] = (float)((uint)bVar45 * auVar111._20_4_ | (uint)!bVar45 * (int)pfVar4[5]);
      pfVar4[6] = (float)((uint)bVar46 * auVar111._24_4_ | (uint)!bVar46 * (int)pfVar4[6]);
      pfVar4[7] = (float)((uint)bVar24 * auVar111._28_4_ | (uint)!bVar24 * (int)pfVar4[7]);
      pfVar4[8] = (float)((uint)(bVar72 & 1) * auVar111._32_4_ |
                         (uint)!(bool)(bVar72 & 1) * (int)pfVar4[8]);
      pfVar4[9] = (float)((uint)bVar25 * auVar111._36_4_ | (uint)!bVar25 * (int)pfVar4[9]);
      pfVar4[10] = (float)((uint)bVar26 * auVar111._40_4_ | (uint)!bVar26 * (int)pfVar4[10]);
      pfVar4[0xb] = (float)((uint)bVar27 * auVar111._44_4_ | (uint)!bVar27 * (int)pfVar4[0xb]);
      pfVar4[0xc] = (float)((uint)bVar28 * auVar111._48_4_ | (uint)!bVar28 * (int)pfVar4[0xc]);
      pfVar4[0xd] = (float)((uint)bVar29 * auVar111._52_4_ | (uint)!bVar29 * (int)pfVar4[0xd]);
      pfVar4[0xe] = (float)((uint)bVar30 * auVar111._56_4_ | (uint)!bVar30 * (int)pfVar4[0xe]);
      pfVar4[0xf] = (float)((uint)(bVar72 >> 7) * auVar111._60_4_ |
                           (uint)!(bool)(bVar72 >> 7) * (int)pfVar4[0xf]);
      pfVar4 = (pIVar43->IO).NavInputsDownDuration + lVar65;
      bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
      bVar69 = (bool)((byte)(uVar73 >> 2) & 1);
      bVar44 = (bool)((byte)(uVar73 >> 3) & 1);
      bVar70 = (bool)((byte)(uVar73 >> 4) & 1);
      bVar45 = (bool)((byte)(uVar73 >> 5) & 1);
      bVar46 = (bool)((byte)(uVar73 >> 6) & 1);
      bVar24 = (bool)((byte)(uVar73 >> 7) & 1);
      bVar25 = (bool)(bVar72 >> 1 & 1);
      bVar26 = (bool)(bVar72 >> 2 & 1);
      bVar27 = (bool)(bVar72 >> 3 & 1);
      bVar28 = (bool)(bVar72 >> 4 & 1);
      bVar29 = (bool)(bVar72 >> 5 & 1);
      bVar30 = (bool)(bVar72 >> 6 & 1);
      *pfVar4 = (float)((uint)(bVar55 & 1) * auVar111._0_4_ |
                       (uint)!(bool)(bVar55 & 1) * (int)*pfVar4);
      pfVar4[1] = (float)((uint)bVar71 * auVar111._4_4_ | (uint)!bVar71 * (int)pfVar4[1]);
      pfVar4[2] = (float)((uint)bVar69 * auVar111._8_4_ | (uint)!bVar69 * (int)pfVar4[2]);
      pfVar4[3] = (float)((uint)bVar44 * auVar111._12_4_ | (uint)!bVar44 * (int)pfVar4[3]);
      pfVar4[4] = (float)((uint)bVar70 * auVar111._16_4_ | (uint)!bVar70 * (int)pfVar4[4]);
      pfVar4[5] = (float)((uint)bVar45 * auVar111._20_4_ | (uint)!bVar45 * (int)pfVar4[5]);
      pfVar4[6] = (float)((uint)bVar46 * auVar111._24_4_ | (uint)!bVar46 * (int)pfVar4[6]);
      pfVar4[7] = (float)((uint)bVar24 * auVar111._28_4_ | (uint)!bVar24 * (int)pfVar4[7]);
      pfVar4[8] = (float)((uint)(bVar72 & 1) * auVar111._32_4_ |
                         (uint)!(bool)(bVar72 & 1) * (int)pfVar4[8]);
      pfVar4[9] = (float)((uint)bVar25 * auVar111._36_4_ | (uint)!bVar25 * (int)pfVar4[9]);
      pfVar4[10] = (float)((uint)bVar26 * auVar111._40_4_ | (uint)!bVar26 * (int)pfVar4[10]);
      pfVar4[0xb] = (float)((uint)bVar27 * auVar111._44_4_ | (uint)!bVar27 * (int)pfVar4[0xb]);
      pfVar4[0xc] = (float)((uint)bVar28 * auVar111._48_4_ | (uint)!bVar28 * (int)pfVar4[0xc]);
      pfVar4[0xd] = (float)((uint)bVar29 * auVar111._52_4_ | (uint)!bVar29 * (int)pfVar4[0xd]);
      pfVar4[0xe] = (float)((uint)bVar30 * auVar111._56_4_ | (uint)!bVar30 * (int)pfVar4[0xe]);
      pfVar4[0xf] = (float)((uint)(bVar72 >> 7) * auVar111._60_4_ |
                           (uint)!(bool)(bVar72 >> 7) * (int)pfVar4[0xf]);
      lVar65 = lVar65 + 0x10;
    } while (lVar65 != 0x20);
    (pIVar43->IO).AppFocusLost = false;
  }
  pIVar68 = GImGui;
  bVar71 = (GImGui->IO).KeyCtrl;
  uVar47 = bVar71 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar47 = (uint)bVar71;
  }
  uVar49 = uVar47 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar49 = uVar47;
  }
  uVar47 = uVar49 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar47 = uVar49;
  }
  (pIVar43->IO).KeyMods = uVar47;
  memcpy((pIVar43->IO).KeysDownDurationPrev,(pIVar43->IO).KeysDownDuration,0x800);
  lVar65 = 0x144;
  do {
    fVar89 = -1.0;
    if (*(char *)((long)(pIVar43->IO).KeyMap + lVar65 + -0x3c) == '\x01') {
      fVar90 = *(float *)((long)pIVar43 + lVar65 * 4 + -0x5c);
      fVar89 = 0.0;
      if (0.0 <= fVar90) {
        fVar89 = fVar90 + fVar74;
      }
    }
    *(float *)((long)pIVar43 + lVar65 * 4 + -0x5c) = fVar89;
    lVar65 = lVar65 + 1;
  } while (lVar65 != 0x344);
  (pIVar68->IO).WantSetMousePos = false;
  uVar47 = (pIVar68->IO).ConfigFlags;
  if (((uVar47 & 2) == 0) || (((pIVar68->IO).BackendFlags & 1) == 0)) {
    bVar71 = false;
  }
  else {
    bVar71 = true;
    if ((pIVar68->NavInputSource != ImGuiInputSource_Gamepad) &&
       (((0.0 < (pIVar68->IO).NavInputs[0] || (0.0 < (pIVar68->IO).NavInputs[2])) ||
        ((0.0 < (pIVar68->IO).NavInputs[1] ||
         ((((0.0 < (pIVar68->IO).NavInputs[3] || (0.0 < (pIVar68->IO).NavInputs[4])) ||
           (0.0 < (pIVar68->IO).NavInputs[5])) ||
          ((0.0 < (pIVar68->IO).NavInputs[6] || (bVar71 = true, 0.0 < (pIVar68->IO).NavInputs[7]))))
         )))))) {
      pIVar68->NavInputSource = ImGuiInputSource_Gamepad;
      bVar71 = true;
    }
  }
  if ((uVar47 & 1) != 0) {
    lVar65 = (long)(pIVar68->IO).KeyMap[0xc];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[0] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[0xd];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[2] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[0xe];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[1] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[1];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[0x10] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[2];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[0x11] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[3];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[0x12] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    lVar65 = (long)(pIVar68->IO).KeyMap[4];
    if ((-1 < lVar65) && ((pIVar68->IO).KeysDown[lVar65] == true)) {
      (pIVar68->IO).NavInputs[0x13] = 1.0;
      pIVar68->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar68->IO).KeyCtrl == true) {
      (pIVar68->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar68->IO).KeyShift == true) {
      (pIVar68->IO).NavInputs[0xf] = 1.0;
    }
  }
  auVar111 = *(undefined1 (*) [64])(pIVar68->IO).NavInputsDownDuration;
  auVar87 = auVar111._16_48_;
  uVar36 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 6);
  uVar32 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 8);
  uVar33 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 10);
  uVar34 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 0xc);
  uVar40 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 0xe);
  uVar41 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 0x10);
  uVar42 = *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 0x12);
  lVar65 = 0;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 4) =
       *(undefined8 *)((pIVar68->IO).NavInputsDownDuration + 4);
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 6) = uVar36;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 8) = uVar32;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 10) = uVar33;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 0xc) = uVar34;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 0xe) = uVar40;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 0x10) = uVar41;
  *(undefined8 *)((pIVar68->IO).NavInputsDownDurationPrev + 0x12) = uVar42;
  *(undefined1 (*) [64])(pIVar68->IO).NavInputsDownDurationPrev = auVar111;
  do {
    fVar74 = -1.0;
    if (0.0 < (pIVar68->IO).NavInputs[lVar65]) {
      fVar89 = (pIVar68->IO).NavInputsDownDuration[lVar65];
      fVar74 = 0.0;
      if (0.0 <= fVar89) {
        fVar74 = fVar89 + (pIVar68->IO).DeltaTime;
      }
    }
    (pIVar68->IO).NavInputsDownDuration[lVar65] = fVar74;
    lVar65 = lVar65 + 1;
  } while (lVar65 != 0x14);
  if (pIVar68->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar68->NavInitRequest = false;
  pIVar68->NavInitRequestFromMove = false;
  pIVar68->NavInitResultId = 0;
  pIVar68->NavJustMovedToId = 0;
  if (pIVar68->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar68->NavTabbingCounter = 0;
  pIVar68->NavMoveSubmitted = false;
  pIVar68->NavMoveScoringItems = false;
  if ((((pIVar68->NavMousePosDirty == true) && (pIVar68->NavIdIsAlive == true)) &&
      (pIVar68->NavDisableHighlight == false)) && (pIVar68->NavDisableMouseHover == true)) {
    bVar69 = pIVar68->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar69 = false;
  }
  pIVar68->NavMousePosDirty = false;
  pIVar51 = pIVar68->NavWindow;
  pIVar59 = pIVar51;
  if (pIVar51 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar59->RootWindow == pIVar59) || ((pIVar59->Flags & 0x14000000) != 0)) {
        if (pIVar59 != pIVar51) {
          pIVar59->NavLastChildNavWindow = pIVar51;
        }
        break;
      }
      ppIVar1 = &pIVar59->ParentWindow;
      pIVar59 = *ppIVar1;
    } while (*ppIVar1 != (ImGuiWindow *)0x0);
    if ((pIVar51->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar68->NavLayer == ImGuiNavLayer_Main)) {
      pIVar51->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar66 = GImGui;
  pIVar51 = GetTopMostPopupModal();
  if (pIVar51 != (ImGuiWindow *)0x0) {
    pIVar66->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar66->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),ZEXT416((uint)(pIVar66->IO).DeltaTime),
                              ZEXT416((uint)pIVar66->NavWindowingHighlightAlpha));
    auVar93._0_12_ = ZEXT812(0);
    auVar93._12_4_ = 0;
    uVar36 = vcmpss_avx512f(auVar93,auVar76,2);
    fVar74 = (float)((uint)((byte)uVar36 & 1) * auVar76._0_4_);
    pIVar66->NavWindowingHighlightAlpha = fVar74;
    if ((pIVar66->DimBgRatio <= 0.0) && (fVar74 <= 0.0)) {
      pIVar66->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar51 == (ImGuiWindow *)0x0) && (pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    uVar36 = vcmpss_avx512f(ZEXT816(0) << 0x40,ZEXT416((uint)(pIVar66->IO).NavInputsDownDuration[3])
                            ,0);
    bVar44 = (bool)((byte)uVar36 & 1);
    if (((pIVar66->IO).KeyCtrl != true) || (iVar61 = (pIVar66->IO).KeyMap[0], iVar61 < 0))
    goto LAB_002b3616;
    bVar70 = IsKeyPressed(iVar61,true);
  }
  else {
    bVar44 = false;
LAB_002b3616:
    bVar70 = false;
  }
  if (((bVar44 | bVar70) == 1) &&
     ((pIVar51 = pIVar66->NavWindow, pIVar51 != (ImGuiWindow *)0x0 ||
      (pIVar51 = FindWindowNavFocusable((pIVar66->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar51 != (ImGuiWindow *)0x0)))) {
    pIVar51 = pIVar51->RootWindow;
    pIVar66->NavWindowingTargetAnim = pIVar51;
    pIVar66->NavWindowingTarget = pIVar51;
    pIVar66->NavWindowingTimer = 0.0;
    pIVar66->NavWindowingHighlightAlpha = 0.0;
    pIVar66->NavWindowingToggleLayer = bVar44;
    pIVar66->NavInputSource = bVar70 ^ ImGuiInputSource_Gamepad;
  }
  fVar74 = (pIVar66->IO).DeltaTime + pIVar66->NavWindowingTimer;
  pIVar66->NavWindowingTimer = fVar74;
  if (pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_002b3922:
    bVar55 = false;
    pIVar51 = (ImGuiWindow *)0x0;
  }
  else {
    IVar57 = pIVar66->NavInputSource;
    pIVar52 = pIVar66;
    if (IVar57 != ImGuiInputSource_Gamepad) {
LAB_002b388f:
      if (IVar57 == ImGuiInputSource_Keyboard) {
        auVar95._0_4_ = (pIVar66->NavWindowingTimer + -0.2) / 0.05;
        auVar95._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar95);
        uVar36 = vcmpss_avx512f(auVar95,ZEXT816(0) << 0x40,1);
        auVar83._16_48_ = auVar87;
        auVar83._0_16_ = auVar76;
        iVar61 = (uint)!(bool)((byte)uVar36 & 1) * auVar76._0_4_;
        auVar82._4_60_ = auVar83._4_60_;
        auVar82._0_4_ = iVar61;
        uVar36 = vcmpss_avx512f(auVar82._0_16_,ZEXT416((uint)pIVar66->NavWindowingHighlightAlpha),2)
        ;
        bVar44 = (bool)((byte)uVar36 & 1);
        pIVar66->NavWindowingHighlightAlpha =
             (float)((uint)bVar44 * (int)pIVar66->NavWindowingHighlightAlpha +
                    (uint)!bVar44 * iVar61);
        iVar61 = (pIVar52->IO).KeyMap[0];
        if ((-1 < iVar61) && (bVar44 = IsKeyPressed(iVar61,true), bVar44)) {
          NavUpdateWindowingHighlightWindow((pIVar66->IO).KeyShift - 1 | 1);
        }
        if ((pIVar66->IO).KeyCtrl == false) {
          pIVar51 = pIVar66->NavWindowingTarget;
          bVar55 = false;
          goto LAB_002b3927;
        }
      }
      goto LAB_002b3922;
    }
    auVar94._0_4_ = (fVar74 + -0.2) / 0.05;
    auVar94._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar76 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar94);
    uVar36 = vcmpss_avx512f(auVar94,ZEXT816(0) << 0x40,1);
    auVar111._16_48_ = auVar87;
    auVar111._0_16_ = auVar76;
    iVar61 = (uint)!(bool)((byte)uVar36 & 1) * auVar76._0_4_;
    auVar81._4_60_ = auVar111._4_60_;
    auVar81._0_4_ = iVar61;
    uVar36 = vcmpss_avx512f(auVar81._0_16_,ZEXT416((uint)pIVar66->NavWindowingHighlightAlpha),2);
    bVar44 = (bool)((byte)uVar36 & 1);
    fVar74 = (float)((uint)bVar44 * (int)pIVar66->NavWindowingHighlightAlpha +
                    (uint)!bVar44 * iVar61);
    pIVar66->NavWindowingHighlightAlpha = fVar74;
    fVar89 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar90 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar61 = (uint)(0.0 < fVar89) - (uint)(0.0 < fVar90);
    if (iVar61 != 0) {
      NavUpdateWindowingHighlightWindow(iVar61);
      fVar74 = 1.0;
      pIVar66->NavWindowingHighlightAlpha = 1.0;
      pIVar52 = GImGui;
    }
    if (0.0 < (pIVar52->IO).NavInputs[3]) {
      if (pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_002b3922;
      IVar57 = pIVar66->NavInputSource;
      goto LAB_002b388f;
    }
    pbVar63 = &pIVar66->NavWindowingToggleLayer;
    *pbVar63 = (bool)(*pbVar63 & fVar74 < 1.0);
    if (*pbVar63 == false) {
      pIVar51 = pIVar66->NavWindowingTarget;
      bVar55 = false;
    }
    else {
      bVar55 = pIVar66->NavWindow != (ImGuiWindow *)0x0;
      pIVar51 = (ImGuiWindow *)0x0;
    }
    pIVar66->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_002b3927:
  if (((((pIVar66->IO).ConfigFlags & 1) != 0) && ((pIVar66->IO).KeyMods == 4)) &&
     (((pIVar66->IO).KeyModsPrev & 4) == 0)) {
    pIVar66->NavWindowingToggleLayer = true;
    pIVar66->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar66->NavWindowingToggleLayer == true) &&
     (pIVar66->NavInputSource == ImGuiInputSource_Keyboard)) {
    if (((0 < (pIVar66->IO).InputQueueCharacters.Size) ||
        (((pIVar66->IO).KeyCtrl != false || ((pIVar66->IO).KeyShift != false)))) ||
       (bVar44 = true, (pIVar66->IO).KeySuper == true)) {
      bVar44 = false;
      pIVar66->NavWindowingToggleLayer = false;
    }
    if ((((((pIVar66->IO).KeyMods & 4) == 0) && (((pIVar66->IO).KeyModsPrev & 4) != 0)) && (bVar44))
       && ((pIVar66->ActiveId == 0 || (pIVar66->ActiveIdAllowOverlap == true)))) {
      auVar76 = SUB6416(ZEXT464(0xc87a0000),0);
      uVar36 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar66->IO).MousePos.x),2);
      uVar32 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar66->IO).MousePos.y),2);
      uVar33 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar66->IO).MousePosPrev.x),6);
      uVar34 = vcmpps_avx512vl(auVar76,ZEXT416((uint)(pIVar66->IO).MousePosPrev.y),6);
      bVar55 = ((byte)uVar33 | (byte)uVar34) ^ (byte)uVar36 & (byte)uVar32 | bVar55;
    }
    if ((pIVar66->IO).KeyAlt == false) {
      pIVar66->NavWindowingToggleLayer = false;
    }
  }
  pIVar59 = pIVar66->NavWindowingTarget;
  if ((pIVar59 != (ImGuiWindow *)0x0) && ((pIVar59->Flags & 4) == 0)) {
    if (pIVar66->NavInputSource == ImGuiInputSource_Gamepad) {
      auVar84._0_8_ = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
      auVar84._8_56_ = extraout_var;
      auVar96 = auVar84._0_16_;
    }
    else {
      auVar96._0_12_ = ZEXT812(0);
      auVar96._12_4_ = 0;
      if ((pIVar66->NavInputSource == ImGuiInputSource_Keyboard) &&
         ((pIVar66->IO).KeyShift == false)) {
        fVar74 = 0.0;
        fVar89 = 0.0;
        lVar65 = (long)(GImGui->IO).KeyMap[2];
        if (-1 < lVar65) {
          fVar89 = (float)(int)(GImGui->IO).KeysDown[lVar65];
        }
        lVar65 = (long)(GImGui->IO).KeyMap[1];
        if (-1 < lVar65) {
          fVar74 = (float)(int)(GImGui->IO).KeysDown[lVar65];
        }
        lVar65 = (long)(GImGui->IO).KeyMap[4];
        fVar90 = 0.0;
        fVar128 = 0.0;
        if (-1 < lVar65) {
          fVar128 = (float)(int)(GImGui->IO).KeysDown[lVar65];
        }
        lVar65 = (long)(GImGui->IO).KeyMap[3];
        if (-1 < lVar65) {
          fVar90 = (float)(int)(GImGui->IO).KeysDown[lVar65];
        }
        auVar96 = vinsertps_avx(ZEXT416((uint)(fVar89 - fVar74)),ZEXT416((uint)(fVar128 - fVar90)),
                                0x10);
      }
    }
    if (auVar96._0_4_ == 0.0) {
      auVar76 = vmovshdup_avx(auVar96);
      if ((auVar76._0_4_ == 0.0) && (!NAN(auVar76._0_4_))) goto LAB_002b3bf1;
    }
    pIVar59 = pIVar59->RootWindow;
    auVar76 = vminss_avx(ZEXT416((uint)(pIVar66->IO).DisplayFramebufferScale.x),
                         ZEXT416((uint)(pIVar66->IO).DisplayFramebufferScale.y));
    auVar76 = vcvtdq2ps_avx(ZEXT416((uint)(int)((pIVar66->IO).DeltaTime * 800.0 * auVar76._0_4_)));
    fVar74 = auVar76._0_4_;
    auVar97._0_4_ = (pIVar59->Pos).x + auVar96._0_4_ * fVar74;
    auVar97._4_4_ = (pIVar59->Pos).y + auVar96._4_4_ * fVar74;
    auVar97._8_4_ = auVar96._8_4_ * fVar74 + 0.0;
    auVar97._12_4_ = auVar96._12_4_ * fVar74 + 0.0;
    local_38 = (ImVec2)vmovlps_avx(auVar97);
    SetWindowPos(pIVar59,&local_38,1);
    if (((pIVar59->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
      GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
    }
    pIVar66->NavDisableMouseHover = true;
  }
LAB_002b3bf1:
  if (pIVar51 != (ImGuiWindow *)0x0) {
    if ((pIVar66->NavWindow == (ImGuiWindow *)0x0) || (pIVar51 != pIVar66->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar52 = GImGui;
      pIVar52->NavMousePosDirty = true;
      pIVar52->NavDisableHighlight = false;
      pIVar52->NavDisableMouseHover = true;
      pIVar59 = pIVar51->NavLastChildNavWindow;
      if ((pIVar59 == (ImGuiWindow *)0x0) || (pIVar59->WasActive == false)) {
        pIVar59 = pIVar51;
      }
      ClosePopupsOverWindow(pIVar59,false);
      FocusWindow(pIVar59);
      if (pIVar59->NavLastIds[0] == 0) {
        NavInitWindow(pIVar59,false);
      }
      if ((pIVar59->DC).NavLayersActiveMaskNext == 2) {
        pIVar66->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar66->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bVar55 & 1) != 0) && (pIVar66->NavWindow != (ImGuiWindow *)0x0)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
    pIVar51 = pIVar66->NavWindow;
    pIVar59 = pIVar51;
    do {
      window = pIVar59;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar59 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar51) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar51;
      pIVar51 = pIVar66->NavWindow;
    }
    IVar12 = pIVar66->NavLayer;
    if (((pIVar51->DC).NavLayersActiveMask & 2) == 0) {
      layer = ImGuiNavLayer_Main;
      if (IVar12 == ImGuiNavLayer_Main) goto LAB_002b3d7e;
    }
    else if (IVar12 == ImGuiNavLayer_Main) {
      layer = ImGuiNavLayer_Menu;
      pIVar51->NavLastIds[1] = 0;
    }
    else {
      layer = IVar12 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(layer);
    pIVar66 = GImGui;
    pIVar66->NavMousePosDirty = true;
    pIVar66->NavDisableHighlight = false;
    pIVar66->NavDisableMouseHover = true;
  }
LAB_002b3d7e:
  if (((uVar47 & 1) == 0 && !bVar71) || (pIVar68->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar68->IO).NavActive = false;
LAB_002b3dde:
    bVar44 = pIVar68->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar44 = (pIVar68->NavWindow->Flags & 0x40000U) == 0;
    (pIVar68->IO).NavActive = bVar44;
    if (((!bVar44) || (pIVar68->NavId == 0)) ||
       (bVar44 = true, pIVar68->NavDisableHighlight != false)) goto LAB_002b3dde;
  }
  (pIVar68->IO).NavVisible = bVar44;
  pIVar66 = GImGui;
  fVar74 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar74 == 0.0) && (!NAN(fVar74))) {
    if (GImGui->ActiveId == 0) {
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        pIVar51 = GImGui->NavWindow;
        if (pIVar51 == (ImGuiWindow *)0x0) {
          uVar49 = (GImGui->OpenPopupStack).Size;
          if ((int)uVar49 < 1) goto LAB_002b444d;
LAB_002b4200:
          if ((((GImGui->OpenPopupStack).Data[(ulong)uVar49 - 1].Window)->Flags & 0x8000000) == 0) {
            ClosePopupToLevel(uVar49 - 1,true);
          }
        }
        else if (((pIVar51 == pIVar51->RootWindow) || ((pIVar51->Flags & 0x4000000) != 0)) ||
                (pIVar59 = pIVar51->ParentWindow, pIVar59 == (ImGuiWindow *)0x0)) {
          uVar49 = (GImGui->OpenPopupStack).Size;
          if (0 < (int)uVar49) goto LAB_002b4200;
          if ((pIVar51->Flags & 0x5000000U) != 0x1000000) {
            pIVar51->NavLastIds[0] = 0;
          }
LAB_002b444d:
          pIVar66->NavId = 0;
          pIVar66->NavFocusScopeId = 0;
        }
        else {
          IVar10 = pIVar51->Pos;
          local_88._4_4_ = IVar10.y + (pIVar51->Size).y;
          local_88._0_4_ = IVar10.x + (pIVar51->Size).x;
          local_68._8_8_ = 0;
          local_68._0_4_ = IVar10.x;
          local_68._4_4_ = IVar10.y;
          local_88._8_8_ = 0;
          FocusWindow(pIVar59);
          pIVar66 = GImGui;
          auVar98._8_8_ = 0;
          auVar98._0_4_ = (pIVar59->DC).CursorStartPos.x;
          auVar98._4_4_ = (pIVar59->DC).CursorStartPos.y;
          IVar56 = pIVar51->ChildId;
          GImGui->NavId = IVar56;
          pIVar66->NavLayer = ImGuiNavLayer_Main;
          pIVar66->NavFocusScopeId = 0;
          pIVar51 = pIVar66->NavWindow;
          auVar76 = vsubps_avx(local_68,auVar98);
          auVar77 = vsubps_avx(local_88,auVar98);
          IVar31 = (ImRect)vmovlhps_avx(auVar76,auVar77);
          pIVar51->NavLastIds[0] = IVar56;
          pIVar51->NavRectRel[0] = IVar31;
          pIVar66->NavMousePosDirty = true;
          pIVar66->NavDisableHighlight = false;
          pIVar66->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar66 = GImGui;
        pIVar66->NavMousePosDirty = true;
        pIVar66->NavDisableHighlight = false;
        pIVar66->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar68->NavActivateFlags = 0;
  pIVar68->NavActivateId = 0;
  pIVar68->NavActivateDownId = 0;
  pIVar68->NavActivatePressedId = 0;
  pIVar68->NavActivateInputId = 0;
  IVar56 = pIVar68->NavId;
  if (((IVar56 == 0) || (pIVar68->NavDisableHighlight != false)) ||
     (pIVar68->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_002b3e8f:
    if ((pIVar68->NavWindow != (ImGuiWindow *)0x0) && ((pIVar68->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar68->NavDisableHighlight = true;
    }
  }
  else if (pIVar68->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar68->NavWindow->Flags & 0x40000) != 0) goto LAB_002b3e8f;
    fVar74 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar74) {
      uVar36 = vcmpss_avx512f(ZEXT816(0) << 0x40,
                              ZEXT416((uint)(GImGui->IO).NavInputsDownDuration[0]),0);
      bVar55 = (byte)uVar36 & 1;
    }
    else {
      bVar55 = 0;
    }
    if ((GImGui->IO).NavInputs[2] <= 0.0) {
      bVar72 = 0;
    }
    else {
      auVar116._0_12_ = ZEXT812(0);
      auVar116._12_4_ = 0;
      uVar36 = vcmpss_avx512f(auVar116,ZEXT416((uint)(GImGui->IO).NavInputsDownDuration[2]),0);
      bVar72 = (byte)uVar36 & 1;
    }
    IVar48 = pIVar68->ActiveId;
    if (bVar55 == 1 && IVar48 == 0) {
      pIVar68->NavActivateId = IVar56;
      pIVar68->NavActivateFlags = 2;
LAB_002b450a:
      if (bVar72 != 0) {
        pIVar68->NavActivateInputId = IVar56;
        pIVar68->NavActivateFlags = 1;
      }
      if (0.0 < fVar74) {
        pIVar68->NavActivateDownId = IVar56;
      }
    }
    else {
      if (IVar48 == 0) goto LAB_002b450a;
      if ((bVar72 & IVar48 == IVar56) != 0) {
        pIVar68->NavActivateInputId = IVar56;
        pIVar68->NavActivateFlags = 1;
      }
      if (IVar48 == IVar56 && 0.0 < fVar74) {
        pIVar68->NavActivateDownId = IVar56;
      }
      bVar55 = bVar55 & IVar48 == IVar56;
    }
    if (bVar55 != 0) {
      pIVar68->NavActivatePressedId = IVar56;
    }
    goto LAB_002b3e8f;
  }
  IVar56 = pIVar68->NavNextActivateId;
  if (IVar56 != 0) {
    if ((pIVar68->NavNextActivateFlags & 1U) == 0) {
      pIVar68->NavActivatePressedId = IVar56;
      pIVar68->NavActivateDownId = IVar56;
      pIVar68->NavActivateId = IVar56;
    }
    else {
      pIVar68->NavActivateInputId = IVar56;
    }
    pIVar68->NavActivateFlags = pIVar68->NavNextActivateFlags;
  }
  pIVar68->NavNextActivateId = 0;
  pIVar66 = GImGui;
  pIVar51 = GImGui->NavWindow;
  if ((pIVar51 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) == 1) {
    IVar62 = GImGui->NavMoveDir;
LAB_002b4250:
    local_88._0_4_ = 0.0;
    if ((((IVar62 != -1) || (((pIVar66->IO).ConfigFlags & 1U) == 0)) ||
        ((pIVar51->Flags & 0x40000) != 0)) || (pIVar66->NavWindowingTarget != (ImGuiWindow *)0x0))
    goto LAB_002b45cb;
    lVar65 = (long)(pIVar66->IO).KeyMap[5];
    bVar44 = false;
    if ((-1 < lVar65) && ((pIVar66->IO).KeysDown[lVar65] == true)) {
      bVar44 = (pIVar66->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    lVar65 = (long)(pIVar66->IO).KeyMap[6];
    bVar70 = false;
    if ((-1 < lVar65) && (bVar70 = false, (pIVar66->IO).KeysDown[lVar65] == true)) {
      bVar70 = (pIVar66->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar45 = IsKeyPressed((pIVar66->IO).KeyMap[7],true);
    if (bVar45) {
      bVar45 = (pIVar66->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar45 = false;
    }
    bVar46 = IsKeyPressed((pIVar66->IO).KeyMap[8],true);
    if (bVar46) {
      bVar46 = (pIVar66->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar46 = false;
    }
    local_88._0_4_ = 0.0;
    if ((bVar44 == bVar70) && (bVar45 == bVar46)) goto LAB_002b45cb;
    if (pIVar66->NavLayer != ImGuiNavLayer_Main) {
      NavRestoreLayer(ImGuiNavLayer_Main);
    }
    if (((pIVar51->DC).NavLayersActiveMask == 0) && ((pIVar51->DC).NavHasScroll == true)) {
      bVar44 = IsKeyPressed((pIVar66->IO).KeyMap[5],true);
      if (bVar44) {
        fVar74 = (pIVar51->Scroll).y - ((pIVar51->InnerRect).Max.y - (pIVar51->InnerRect).Min.y);
      }
      else {
        bVar44 = IsKeyPressed((pIVar66->IO).KeyMap[6],true);
        if (!bVar44) {
          local_88._0_4_ = 0.0;
          if (bVar45 == false) {
            if (bVar46 == false) goto LAB_002b45cb;
            (pIVar51->ScrollTarget).y = (pIVar51->ScrollMax).y;
          }
          else {
            (pIVar51->ScrollTarget).y = 0.0;
          }
          (pIVar51->ScrollTargetCenterRatio).y = 0.0;
          (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
          goto LAB_002b45cb;
        }
        fVar74 = ((pIVar51->InnerRect).Max.y - (pIVar51->InnerRect).Min.y) + (pIVar51->Scroll).y;
      }
      (pIVar51->ScrollTarget).y = fVar74;
      (pIVar51->ScrollTargetCenterRatio).y = 0.0;
      (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
      goto LAB_002b40b3;
    }
    fVar74 = GImGui->FontBaseSize * pIVar51->FontWindowScale;
    pIVar5 = pIVar51->NavRectRel + pIVar66->NavLayer;
    if (pIVar51->ParentWindow != (ImGuiWindow *)0x0) {
      fVar74 = fVar74 * pIVar51->ParentWindow->FontWindowScale;
    }
    fVar74 = (((pIVar51->InnerRect).Max.y - (pIVar51->InnerRect).Min.y) - fVar74) +
             ((pIVar5->Max).y - (pIVar5->Min).y);
    auVar99._0_12_ = ZEXT812(0);
    auVar99._12_4_ = 0;
    uVar36 = vcmpss_avx512f(ZEXT416((uint)fVar74),auVar99,2);
    auVar86._16_48_ = auVar87;
    auVar86._0_16_ = ZEXT416((uint)fVar74);
    auVar85._4_60_ = auVar86._4_60_;
    auVar85._0_4_ = (uint)!(bool)((byte)uVar36 & 1) * (int)fVar74;
    auVar76 = auVar85._0_16_;
    bVar44 = IsKeyPressed((pIVar66->IO).KeyMap[5],true);
    if (bVar44) {
      IVar62 = 2;
      IVar58 = 3;
      auVar39._8_4_ = 0x80000000;
      auVar39._0_8_ = 0x8000000080000000;
      auVar39._12_4_ = 0x80000000;
      auVar76 = vxorps_avx512vl(auVar76,auVar39);
LAB_002b4570:
      pIVar66->NavMoveDir = IVar58;
      pIVar66->NavMoveClipDir = IVar62;
      pIVar66->NavMoveFlags = 0x30;
      local_88._0_4_ = auVar76._0_4_;
      if (((float)local_88._0_4_ != 0.0) || (NAN((float)local_88._0_4_))) {
        IVar10 = (pIVar51->InnerRect).Max;
        (pIVar66->NavScoringNoClipRect).Min = (pIVar51->InnerRect).Min;
        (pIVar66->NavScoringNoClipRect).Max = IVar10;
        (pIVar66->NavScoringNoClipRect).Min.y =
             (float)local_88._0_4_ + (pIVar66->NavScoringNoClipRect).Min.y;
        (pIVar66->NavScoringNoClipRect).Max.y =
             (float)local_88._0_4_ + (pIVar66->NavScoringNoClipRect).Max.y;
      }
      goto LAB_002b45cb;
    }
    bVar44 = IsKeyPressed((pIVar66->IO).KeyMap[6],true);
    if (bVar44) {
      IVar62 = 3;
      IVar58 = 2;
      goto LAB_002b4570;
    }
    if (bVar45 == false) {
      local_88._0_4_ = 0.0;
      if (bVar46 == false) goto LAB_002b45cb;
      fVar74 = (pIVar51->ContentSize).y;
      iVar61 = 2;
      (pIVar5->Max).y = fVar74;
      (pIVar5->Min).y = fVar74;
    }
    else {
      (pIVar5->Max).y = 0.0;
      (pIVar5->Min).y = 0.0;
      iVar61 = 3;
    }
    if ((pIVar5->Max).x < (pIVar5->Min).x) {
      (pIVar5->Max).x = 0.0;
      (pIVar5->Min).x = 0.0;
    }
    local_88._0_4_ = 0.0;
    pIVar66->NavMoveDir = iVar61;
    pIVar66->NavMoveFlags = 0x50;
    pIVar66->NavMoveForwardToNextFrame = false;
    move_flags = 0x50;
LAB_002b45ec:
    NavMoveRequestSubmit(iVar61,pIVar66->NavMoveClipDir,move_flags,pIVar66->NavMoveScrollFlags);
  }
  else {
    GImGui->NavMoveDir = -1;
    pIVar66->NavMoveFlags = 0;
    pIVar66->NavMoveScrollFlags = 0;
    if (pIVar51 != (ImGuiWindow *)0x0) {
      IVar62 = -1;
      if ((pIVar66->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar51->Flags & 0x40000) == 0))
      {
        uVar49 = pIVar66->ActiveIdUsingNavDirMask;
        if (((uVar49 & 1) == 0) &&
           ((fVar74 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar74 ||
            (fVar74 = GetNavInputAmount(0x10,ImGuiInputReadMode_Repeat), 0.0 < fVar74)))) {
          IVar62 = 0;
          pIVar66->NavMoveDir = 0;
        }
        if (((uVar49 & 2) == 0) &&
           ((fVar74 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar74 ||
            (fVar74 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar74)))) {
          IVar62 = 1;
          pIVar66->NavMoveDir = 1;
        }
        if (((uVar49 & 4) == 0) &&
           ((fVar74 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar74 ||
            (fVar74 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar74)))) {
          IVar62 = 2;
          pIVar66->NavMoveDir = 2;
        }
        if (((uVar49 & 8) == 0) &&
           ((fVar74 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar74 ||
            (fVar74 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar74)))) {
          IVar62 = 3;
          pIVar66->NavMoveDir = 3;
        }
      }
      pIVar66->NavMoveClipDir = IVar62;
      (pIVar66->NavScoringNoClipRect).Min.x = 3.4028235e+38;
      (pIVar66->NavScoringNoClipRect).Min.y = 3.4028235e+38;
      (pIVar66->NavScoringNoClipRect).Max.x = -3.4028235e+38;
      (pIVar66->NavScoringNoClipRect).Max.y = -3.4028235e+38;
      goto LAB_002b4250;
    }
    pIVar66->NavMoveClipDir = -1;
    (pIVar66->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar66->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar66->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar66->NavScoringNoClipRect).Max.y = -3.4028235e+38;
LAB_002b40b3:
    local_88._0_4_ = 0.0;
LAB_002b45cb:
    iVar61 = pIVar66->NavMoveDir;
    pIVar66->NavMoveForwardToNextFrame = false;
    if (iVar61 != -1) {
      move_flags = pIVar66->NavMoveFlags;
      goto LAB_002b45ec;
    }
  }
  if (pIVar66->NavMoveSubmitted == true) {
    if (pIVar66->NavId == 0) {
      pIVar66->NavInitRequest = true;
      pIVar66->NavInitRequestFromMove = true;
      pIVar66->NavInitResultId = 0;
      pIVar66->NavDisableHighlight = false;
    }
    if ((pIVar66->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar66->NavLayer != ImGuiNavLayer_Main || pIVar51 == (ImGuiWindow *)0x0))
    goto LAB_002b4770;
    auVar117._8_8_ = 0;
    auVar117._0_4_ = (pIVar51->InnerRect).Min.x;
    auVar117._4_4_ = (pIVar51->InnerRect).Min.y;
    auVar123._8_8_ = 0;
    auVar123._0_4_ = (pIVar51->InnerRect).Max.x;
    auVar123._4_4_ = (pIVar51->InnerRect).Max.y;
    auVar100._8_8_ = 0;
    auVar100._0_4_ = (pIVar51->DC).CursorStartPos.x;
    auVar100._4_4_ = (pIVar51->DC).CursorStartPos.y;
    auVar37._8_4_ = 0xbf800000;
    auVar37._0_8_ = 0xbf800000bf800000;
    auVar37._12_4_ = 0xbf800000;
    auVar76 = vaddps_avx512vl(auVar117,auVar37);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar77 = vaddps_avx512vl(auVar123,auVar38);
    auVar76 = vsubps_avx(auVar76,auVar100);
    auVar77 = vsubps_avx(auVar77,auVar100);
    fVar74 = pIVar51->NavRectRel[0].Min.x;
    if ((((fVar74 < auVar76._0_4_) ||
         (auVar75 = vmovshdup_avx(auVar76), pIVar51->NavRectRel[0].Min.y < auVar75._0_4_)) ||
        (auVar77._0_4_ < pIVar51->NavRectRel[0].Max.x)) ||
       (auVar75 = vmovshdup_avx(auVar77), auVar75._0_4_ < pIVar51->NavRectRel[0].Max.y)) {
      fVar89 = GImGui->FontBaseSize * pIVar51->FontWindowScale;
      if (pIVar51->ParentWindow != (ImGuiWindow *)0x0) {
        fVar89 = fVar89 * pIVar51->ParentWindow->FontWindowScale;
      }
      fVar89 = fVar89 * 0.5;
      auVar114 = vsubps_avx(auVar77,auVar76);
      auVar75 = vinsertps_avx(ZEXT416((uint)fVar74),ZEXT416((uint)pIVar51->NavRectRel[0].Min.y),0x10
                             );
      auVar130._4_4_ = fVar89;
      auVar130._0_4_ = fVar89;
      auVar130._8_4_ = fVar89;
      auVar130._12_4_ = fVar89;
      auVar114 = vminps_avx(auVar114,auVar130);
      auVar134._8_8_ = 0;
      auVar134._0_4_ = pIVar51->NavRectRel[0].Max.x;
      auVar134._4_4_ = pIVar51->NavRectRel[0].Max.y;
      auVar118._0_4_ = auVar76._0_4_ + auVar114._0_4_;
      auVar118._4_4_ = auVar76._4_4_ + auVar114._4_4_;
      auVar118._8_4_ = auVar76._8_4_ + auVar114._8_4_;
      auVar118._12_4_ = auVar76._12_4_ + auVar114._12_4_;
      auVar77 = vsubps_avx(auVar77,auVar114);
      uVar50 = vcmpps_avx512vl(auVar75,auVar118,1);
      auVar76 = vminps_avx(auVar77,auVar75);
      bVar44 = (bool)((byte)uVar50 & 1);
      auVar78._0_4_ = (uint)bVar44 * (int)auVar118._0_4_ | (uint)!bVar44 * auVar76._0_4_;
      bVar44 = (bool)((byte)(uVar50 >> 1) & 1);
      auVar78._4_4_ = (uint)bVar44 * (int)auVar118._4_4_ | (uint)!bVar44 * auVar76._4_4_;
      bVar44 = (bool)((byte)(uVar50 >> 2) & 1);
      auVar78._8_4_ = (uint)bVar44 * (int)auVar118._8_4_ | (uint)!bVar44 * auVar76._8_4_;
      bVar44 = (bool)((byte)(uVar50 >> 3) & 1);
      auVar78._12_4_ = (uint)bVar44 * (int)auVar118._12_4_ | (uint)!bVar44 * auVar76._12_4_;
      uVar50 = vcmpps_avx512vl(auVar134,auVar118,1);
      auVar76 = vminps_avx(auVar77,auVar134);
      bVar44 = (bool)((byte)uVar50 & 1);
      auVar79._0_4_ = (uint)bVar44 * (int)auVar118._0_4_ | (uint)!bVar44 * auVar76._0_4_;
      bVar44 = (bool)((byte)(uVar50 >> 1) & 1);
      auVar79._4_4_ = (uint)bVar44 * (int)auVar118._4_4_ | (uint)!bVar44 * auVar76._4_4_;
      bVar44 = (bool)((byte)(uVar50 >> 2) & 1);
      auVar79._8_4_ = (uint)bVar44 * (int)auVar118._8_4_ | (uint)!bVar44 * auVar76._8_4_;
      bVar44 = (bool)((byte)(uVar50 >> 3) & 1);
      auVar79._12_4_ = (uint)bVar44 * (int)auVar118._12_4_ | (uint)!bVar44 * auVar76._12_4_;
      IVar31 = (ImRect)vmovlhps_avx(auVar78,auVar79);
      pIVar51->NavRectRel[0] = IVar31;
      pIVar66->NavId = 0;
      pIVar66->NavFocusScopeId = 0;
    }
LAB_002b4779:
    IVar12 = pIVar66->NavLayer;
    fVar74 = pIVar51->NavRectRel[IVar12].Min.x;
    fVar89 = pIVar51->NavRectRel[IVar12].Max.x;
    if (fVar89 < fVar74) {
LAB_002b47b8:
      fVar128 = 0.0;
      fVar89 = 0.0;
      fVar90 = 0.0;
      fVar74 = 0.0;
    }
    else {
      fVar90 = pIVar51->NavRectRel[IVar12].Min.y;
      fVar128 = pIVar51->NavRectRel[IVar12].Max.y;
      if (fVar128 < fVar90) goto LAB_002b47b8;
    }
    fVar8 = (pIVar51->DC).CursorStartPos.y;
    fVar9 = (pIVar51->DC).CursorStartPos.x;
    auVar77 = vminss_avx(ZEXT416((uint)(fVar74 + fVar9 + 1.0)),ZEXT416((uint)(fVar89 + fVar9)));
    auVar76 = vinsertps_avx(auVar77,ZEXT416((uint)((float)local_88._0_4_ + fVar90 + fVar8)),0x10);
    auVar77 = vinsertps_avx(auVar77,ZEXT416((uint)((float)local_88._0_4_ + fVar128 + fVar8)),0x10);
  }
  else {
LAB_002b4770:
    if (pIVar51 != (ImGuiWindow *)0x0) goto LAB_002b4779;
    auVar77 = ZEXT816(0) << 0x40;
    auVar76 = ZEXT816(0) << 0x40;
  }
  IVar31 = (ImRect)vmovlhps_avx(auVar76,auVar77);
  pIVar66->NavScoringRect = IVar31;
  if (auVar76._0_4_ < (pIVar66->NavScoringNoClipRect).Min.x) {
    (pIVar66->NavScoringNoClipRect).Min.x = auVar76._0_4_;
  }
  auVar76 = vmovshdup_avx(auVar76);
  if (auVar76._0_4_ < (pIVar66->NavScoringNoClipRect).Min.y) {
    (pIVar66->NavScoringNoClipRect).Min.y = auVar76._0_4_;
  }
  if ((pIVar66->NavScoringNoClipRect).Max.x < auVar77._0_4_) {
    (pIVar66->NavScoringNoClipRect).Max.x = auVar77._0_4_;
  }
  auVar76 = vmovshdup_avx(auVar77);
  if ((pIVar66->NavScoringNoClipRect).Max.y < auVar76._0_4_) {
    (pIVar66->NavScoringNoClipRect).Max.y = auVar76._0_4_;
  }
  pIVar66 = GImGui;
  if (((((pIVar68->NavMoveDir == -1) && (pIVar51 = GImGui->NavWindow, pIVar51 != (ImGuiWindow *)0x0)
        ) && ((GImGui->NavWindowingTarget == (ImGuiWindow *)0x0 &&
              (((pIVar51->Flags & 0x40000) == 0 && (iVar61 = (GImGui->IO).KeyMap[0], -1 < iVar61))))
             )) && (bVar44 = IsKeyPressed(iVar61,true), bVar44)) &&
     ((((pIVar66->ActiveIdUsingKeyInputMask & 1) == 0 && ((pIVar66->IO).KeyCtrl == false)) &&
      ((pIVar66->IO).KeyAlt == false)))) {
    if ((pIVar66->IO).KeyShift == false) {
      IVar62 = 3;
      uVar49 = (uint)(pIVar66->ActiveId != 0);
    }
    else {
      IVar62 = 2;
      uVar49 = 0xffffffff;
    }
    bVar44 = pIVar51->Appearing;
    pIVar66->NavTabbingDir = uVar49;
    scroll_flags = 3;
    if (bVar44 != false) {
      scroll_flags = 0x21;
    }
    NavMoveRequestSubmit(-1,IVar62,0x400,scroll_flags);
    auVar121._8_4_ = 0x7f7fffff;
    auVar121._0_8_ = 0x7f7fffff7f7fffff;
    auVar121._12_4_ = 0x7f7fffff;
    (pIVar66->NavTabbingResultFirst).InFlags = 0;
    (pIVar66->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
    (pIVar66->NavTabbingResultFirst).ID = 0;
    (pIVar66->NavTabbingResultFirst).FocusScopeId = 0;
    (pIVar66->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
    uVar36 = vmovlps_avx(auVar121);
    (pIVar66->NavTabbingResultFirst).DistBox = (float)(int)uVar36;
    (pIVar66->NavTabbingResultFirst).DistCenter = (float)(int)((ulong)uVar36 >> 0x20);
    pIVar66->NavTabbingCounter = -1;
    pIVar66 = GImGui;
  }
  bVar44 = true;
  if (pIVar66->NavMoveScoringItems == false) {
    bVar44 = pIVar66->NavInitRequest;
  }
  pIVar66->NavAnyRequest = bVar44;
  pIVar68->NavIdIsAlive = false;
  pIVar51 = pIVar68->NavWindow;
  if (((pIVar51 != (ImGuiWindow *)0x0) && ((pIVar51->Flags & 0x40000) == 0)) &&
     (pIVar68->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar74 = pIVar66->FontBaseSize * pIVar51->FontWindowScale;
    if (pIVar51->ParentWindow != (ImGuiWindow *)0x0) {
      fVar74 = fVar74 * pIVar51->ParentWindow->FontWindowScale;
    }
    auVar76 = vfmadd213ss_fma(ZEXT416((uint)(pIVar68->IO).DeltaTime),ZEXT416((uint)(fVar74 * 100.0))
                              ,ZEXT416(0x3f000000));
    auVar101._0_4_ = (int)auVar76._0_4_;
    auVar101._4_4_ = (int)auVar76._4_4_;
    auVar101._8_4_ = (int)auVar76._8_4_;
    auVar101._12_4_ = (int)auVar76._12_4_;
    auVar76 = vcvtdq2ps_avx(auVar101);
    if (((pIVar51->DC).NavLayersActiveMask == 0) &&
       (uVar49 = pIVar68->NavMoveDir, (uVar49 != 0xffffffff & (pIVar51->DC).NavHasScroll) == 1)) {
      if (uVar49 < 2) {
        auVar77 = vfmadd213ss_fma(ZEXT416(*(uint *)(&DAT_003465e0 + (ulong)(uVar49 == 0) * 4)),
                                  auVar76,ZEXT416((uint)(pIVar51->Scroll).x));
        auVar102._0_4_ = (int)auVar77._0_4_;
        auVar102._4_4_ = (int)auVar77._4_4_;
        auVar102._8_4_ = (int)auVar77._8_4_;
        auVar102._12_4_ = (int)auVar77._12_4_;
        auVar77 = vcvtdq2ps_avx(auVar102);
        (pIVar51->ScrollTarget).x = auVar77._0_4_;
        (pIVar51->ScrollTargetCenterRatio).x = 0.0;
        (pIVar51->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar49 & 0xfffffffe) == 2) {
        auVar77 = vfmadd213ss_fma(ZEXT416(*(uint *)(&DAT_003465e0 + (ulong)(uVar49 == 2) * 4)),
                                  auVar76,ZEXT416((uint)(pIVar51->Scroll).y));
        auVar103._0_4_ = (int)auVar77._0_4_;
        auVar103._4_4_ = (int)auVar77._4_4_;
        auVar103._8_4_ = (int)auVar77._8_4_;
        auVar103._12_4_ = (int)auVar77._12_4_;
        auVar77 = vcvtdq2ps_avx(auVar103);
        (pIVar51->ScrollTarget).y = auVar77._0_4_;
        (pIVar51->ScrollTargetCenterRatio).y = 0.0;
        (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    auVar112._0_8_ = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    auVar112._8_56_ = extraout_var_00;
    if (((auVar112._0_4_ != 0.0) || (NAN(auVar112._0_4_))) && (pIVar51->ScrollbarX == true)) {
      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(pIVar51->Scroll).x),auVar112._0_16_,auVar76);
      auVar124._0_4_ = (int)auVar77._0_4_;
      auVar124._4_4_ = (int)auVar77._4_4_;
      auVar124._8_4_ = (int)auVar77._8_4_;
      auVar124._12_4_ = (int)auVar77._12_4_;
      auVar77 = vcvtdq2ps_avx(auVar124);
      (pIVar51->ScrollTarget).x = auVar77._0_4_;
      (pIVar51->ScrollTargetCenterRatio).x = 0.0;
      (pIVar51->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    auVar77 = vmovshdup_avx(auVar112._0_16_);
    if ((auVar77._0_4_ != 0.0) || (NAN(auVar77._0_4_))) {
      auVar76 = vfmadd213ss_fma(auVar76,auVar77,ZEXT416((uint)(pIVar51->Scroll).y));
      auVar104._0_4_ = (int)auVar76._0_4_;
      auVar104._4_4_ = (int)auVar76._4_4_;
      auVar104._8_4_ = (int)auVar76._8_4_;
      auVar104._12_4_ = (int)auVar76._12_4_;
      auVar76 = vcvtdq2ps_avx(auVar104);
      (pIVar51->ScrollTarget).y = auVar76._0_4_;
      (pIVar51->ScrollTargetCenterRatio).y = 0.0;
      (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar47 & 1) == 0 && !bVar71) {
    pIVar68->NavDisableHighlight = true;
    pIVar68->NavDisableMouseHover = false;
  }
  else if (((bVar69) && (((pIVar68->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar68->IO).BackendFlags & 4) != 0)) {
    auVar113._0_8_ = NavCalcPreferredRefPos();
    auVar113._8_56_ = extraout_var_01;
    IVar10 = (ImVec2)vmovlps_avx(auVar113._0_16_);
    (pIVar68->IO).MousePosPrev = IVar10;
    IVar10 = (ImVec2)vmovlps_avx(auVar113._0_16_);
    (pIVar68->IO).MousePos = IVar10;
    (pIVar68->IO).WantSetMousePos = true;
    pIVar66 = GImGui;
  }
  pIVar68->NavScoringDebugCount = 0;
  IVar10 = (pIVar66->IO).MousePos;
  auVar105._8_8_ = 0;
  auVar105._0_4_ = IVar10.x;
  auVar105._4_4_ = IVar10.y;
  if ((-256000.0 <= IVar10.x) && (auVar76 = vmovshdup_avx(auVar105), -256000.0 <= auVar76._0_4_)) {
    auVar106._0_4_ = (int)IVar10.x;
    auVar106._4_4_ = (int)IVar10.y;
    auVar106._8_8_ = 0;
    auVar105 = vcvtdq2ps_avx(auVar106);
    IVar10 = (ImVec2)vmovlps_avx(auVar105);
    pIVar66->MouseLastValidPos = IVar10;
    IVar10 = (ImVec2)vmovlps_avx(auVar105);
    (pIVar66->IO).MousePos = IVar10;
  }
  auVar76 = vmovshdup_avx(auVar105);
  if ((((auVar105._0_4_ < -256000.0) || (auVar76._0_4_ < -256000.0)) ||
      (IVar10 = (pIVar66->IO).MousePosPrev, auVar125._8_8_ = 0, auVar125._0_4_ = IVar10.x,
      auVar125._4_4_ = IVar10.y, IVar10.x < -256000.0)) ||
     (auVar77 = vmovshdup_avx(auVar125), auVar77._0_4_ < -256000.0)) {
    (pIVar66->IO).MouseDelta.x = 0.0;
    (pIVar66->IO).MouseDelta.y = 0.0;
  }
  else {
    auVar77 = vsubps_avx(auVar105,auVar125);
    IVar10 = (ImVec2)vmovlps_avx(auVar77);
    (pIVar66->IO).MouseDelta = IVar10;
    if ((auVar77._0_4_ == 0.0) && (!NAN(auVar77._0_4_))) {
      auVar77 = vmovshdup_avx(auVar77);
      if ((auVar77._0_4_ == 0.0) && (!NAN(auVar77._0_4_))) goto LAB_002b4b5f;
    }
    pIVar66->NavDisableMouseHover = false;
  }
LAB_002b4b5f:
  IVar10 = (pIVar66->IO).MousePos;
  lVar65 = 0;
  (pIVar66->IO).MousePosPrev = IVar10;
  auVar107._4_12_ = auVar105._4_12_;
  auVar107._0_4_ = IVar10.x;
  uVar50 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),ZEXT416((uint)IVar10.x),2);
  uVar67 = vcmpps_avx512vl(SUB6416(ZEXT464(0xc87a0000),0),auVar76,2);
  do {
    if ((pIVar66->IO).MouseDown[lVar65] == true) {
      fVar74 = (pIVar66->IO).MouseDownDuration[lVar65];
      pbVar63 = (pIVar66->IO).MouseClicked + lVar65;
      *pbVar63 = fVar74 < 0.0;
      (pIVar66->IO).MouseClickedCount[lVar65] = 0;
      pbVar63[0x1e] = false;
      (pIVar66->IO).MouseDownDurationPrev[lVar65] = fVar74;
      if (0.0 <= fVar74) {
        (pIVar66->IO).MouseDownDuration[lVar65] = fVar74 + (pIVar66->IO).DeltaTime;
        auVar131._0_12_ = ZEXT812(0);
        auVar131._12_4_ = 0;
        if ((uVar50 & uVar67 & 1) != 0) {
          pIVar6 = (pIVar66->IO).MouseClickedPos + lVar65;
          auVar132._8_8_ = 0;
          auVar132._0_4_ = pIVar6->x;
          auVar132._4_4_ = pIVar6->y;
          auVar131 = vsubps_avx(auVar107,auVar132);
        }
        auVar139._0_4_ = auVar131._0_4_ * auVar131._0_4_;
        auVar139._4_4_ = auVar131._4_4_ * auVar131._4_4_;
        fVar89 = auVar131._8_4_;
        auVar139._8_4_ = fVar89 * fVar89;
        fVar90 = auVar131._12_4_;
        auVar139._12_4_ = fVar90 * fVar90;
        fVar74 = (pIVar66->IO).MouseDragMaxDistanceSqr[lVar65];
        auVar76 = vmovshdup_avx(auVar139);
        auVar76 = vfmadd231ss_fma(auVar76,auVar131,auVar131);
        uVar36 = vcmpss_avx512f(auVar76,ZEXT416((uint)fVar74),2);
        bVar71 = (bool)((byte)uVar36 & 1);
        (pIVar66->IO).MouseDragMaxDistanceSqr[lVar65] =
             (float)((uint)bVar71 * (int)fVar74 + (uint)!bVar71 * auVar76._0_4_);
        auVar140._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
        auVar140._8_4_ = -fVar89;
        auVar140._12_4_ = -fVar90;
        IVar17 = (pIVar66->IO).MouseDragMaxDistanceAbs[lVar65];
        auVar136._8_8_ = 0;
        auVar136._0_4_ = IVar17.x;
        auVar136._4_4_ = IVar17.y;
        auVar76 = vmaxps_avx(auVar140,auVar131);
        uVar35 = vcmpps_avx512vl(auVar76,auVar136,2);
        bVar71 = (bool)((byte)uVar35 & 1);
        auVar80._0_4_ = (uint)bVar71 * (int)IVar17.x | (uint)!bVar71 * auVar76._0_4_;
        bVar71 = (bool)((byte)(uVar35 >> 1) & 1);
        auVar80._4_4_ = (uint)bVar71 * (int)IVar17.y | (uint)!bVar71 * auVar76._4_4_;
        auVar80._8_4_ = (uint)!(bool)((byte)(uVar35 >> 2) & 1) * auVar76._8_4_;
        auVar80._12_4_ = (uint)!(bool)((byte)(uVar35 >> 3) & 1) * auVar76._12_4_;
        IVar17 = (ImVec2)vmovlps_avx(auVar80);
        (pIVar66->IO).MouseDragMaxDistanceAbs[lVar65] = IVar17;
        goto LAB_002b4d2a;
      }
      (pIVar66->IO).MouseDownDuration[lVar65] = 0.0;
      dVar11 = pIVar66->Time;
      if ((pIVar66->IO).MouseDoubleClickTime <=
          (float)(dVar11 - (pIVar66->IO).MouseClickedTime[lVar65])) {
LAB_002b4d2f:
        (pIVar66->IO).MouseClickedLastCount[lVar65] = 1;
      }
      else {
        auVar76 = ZEXT416(0) << 0x20;
        if ((uVar50 & uVar67 & 1) != 0) {
          pIVar6 = (pIVar66->IO).MouseClickedPos + lVar65;
          auVar135._8_8_ = 0;
          auVar135._0_4_ = pIVar6->x;
          auVar135._4_4_ = pIVar6->y;
          auVar76 = vsubps_avx(auVar107,auVar135);
        }
        auVar138._0_4_ = auVar76._0_4_ * auVar76._0_4_;
        auVar138._4_4_ = auVar76._4_4_ * auVar76._4_4_;
        auVar138._8_4_ = auVar76._8_4_ * auVar76._8_4_;
        auVar138._12_4_ = auVar76._12_4_ * auVar76._12_4_;
        auVar77 = vmovshdup_avx(auVar138);
        auVar76 = vfmadd231ss_fma(auVar77,auVar76,auVar76);
        fVar74 = (pIVar66->IO).MouseDoubleClickMaxDist;
        if (fVar74 * fVar74 <= auVar76._0_4_) goto LAB_002b4d2f;
        pIVar7 = (pIVar66->IO).MouseClickedLastCount + lVar65;
        *pIVar7 = *pIVar7 + 1;
      }
      (pIVar66->IO).MouseClickedTime[lVar65] = dVar11;
      (pIVar66->IO).MouseClickedPos[lVar65] = IVar10;
      (pIVar66->IO).MouseClickedCount[lVar65] = (pIVar66->IO).MouseClickedLastCount[lVar65];
      pIVar6 = (pIVar66->IO).MouseDragMaxDistanceAbs + lVar65;
      pIVar6->x = 0.0;
      pIVar6->y = 0.0;
      (pIVar66->IO).MouseDragMaxDistanceSqr[lVar65] = 0.0;
      bVar71 = (pIVar66->IO).MouseClickedCount[lVar65] == 2;
    }
    else {
      (pIVar66->IO).MouseClicked[lVar65] = false;
      (pIVar66->IO).MouseClickedCount[lVar65] = 0;
      pbVar63 = (pIVar66->IO).MouseClicked + lVar65;
      fVar74 = (pIVar66->IO).MouseDownDuration[lVar65];
      (pIVar66->IO).MouseReleased[lVar65] = 0.0 <= fVar74;
      (pIVar66->IO).MouseDownDurationPrev[lVar65] = fVar74;
      (pIVar66->IO).MouseDownDuration[lVar65] = -1.0;
LAB_002b4d2a:
      bVar71 = false;
    }
    (pIVar66->IO).MouseDoubleClicked[lVar65] = bVar71;
    if (*pbVar63 == true) {
      pIVar66->NavDisableMouseHover = false;
    }
    lVar65 = lVar65 + 1;
  } while (lVar65 != 5);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar51 = GetTopMostPopupModal();
  if ((pIVar51 != (ImGuiWindow *)0x0) ||
     ((pIVar43->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar43->NavWindowingHighlightAlpha)))) {
    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40c00000),0),ZEXT416((uint)(pIVar43->IO).DeltaTime),
                              ZEXT416((uint)pIVar43->DimBgRatio));
    auVar76 = vminss_avx(auVar76,ZEXT416(0x3f800000));
    fVar74 = auVar76._0_4_;
  }
  else {
    auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1200000),0),ZEXT416((uint)(pIVar43->IO).DeltaTime),
                              ZEXT416((uint)pIVar43->DimBgRatio));
    uVar36 = vcmpss_avx512f(ZEXT816(0),auVar76,2);
    fVar74 = (float)((uint)((byte)uVar36 & 1) * auVar76._0_4_);
  }
  pIVar43->DimBgRatio = fVar74;
  pIVar43->MouseCursor = 0;
  pIVar43->WantTextInputNextFrame = -1;
  pIVar43->WantCaptureMouseNextFrame = -1;
  pIVar43->WantCaptureKeyboardNextFrame = -1;
  (pIVar43->PlatformImePos).x = 1.0;
  pIVar68 = GImGui;
  (pIVar43->PlatformImePos).y = 1.0;
  pIVar51 = GImGui->WheelingWindow;
  if (pIVar51 == (ImGuiWindow *)0x0) {
LAB_002b4f82:
    pIVar51 = (ImGuiWindow *)0x0;
  }
  else {
    fVar89 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar89;
    fVar74 = (pIVar68->IO).MousePos.x;
    if ((((-256000.0 <= fVar74) && (fVar90 = (pIVar68->IO).MousePos.y, -256000.0 <= fVar90)) &&
        (fVar90 = fVar90 - (pIVar68->WheelingWindowRefMousePos).y,
        auVar76 = ZEXT416((uint)(fVar74 - (pIVar68->WheelingWindowRefMousePos).x)),
        auVar76 = vfmadd231ss_fma(ZEXT416((uint)(fVar90 * fVar90)),auVar76,auVar76),
        fVar74 = (pIVar68->IO).MouseDragThreshold, fVar74 * fVar74 < auVar76._0_4_)) ||
       (fVar89 <= 0.0)) {
      pIVar68->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar68->WheelingWindowTimer = 0.0;
      goto LAB_002b4f82;
    }
  }
  fVar74 = (pIVar68->IO).MouseWheel;
  if ((((fVar74 != 0.0) || (fVar89 = (pIVar68->IO).MouseWheelH, fVar89 != 0.0)) || (NAN(fVar89))) &&
     (((pIVar68->ActiveId == 0 || (pIVar68->ActiveIdUsingMouseWheel == false)) &&
      (((pIVar68->HoveredIdPreviousFrame == 0 ||
        (pIVar68->HoveredIdPreviousFrameUsingMouseWheel == false)) &&
       (((pIVar59 = pIVar51, pIVar51 != (ImGuiWindow *)0x0 ||
         (pIVar59 = pIVar68->HoveredWindow, pIVar59 != (ImGuiWindow *)0x0)) &&
        (pIVar59->Collapsed == false)))))))) {
    bVar71 = (pIVar68->IO).KeyCtrl;
    auVar76 = ZEXT416((uint)fVar74);
    if ((fVar74 != 0.0) || (NAN(fVar74))) {
      if ((bVar71 & 1U) == 0) goto LAB_002b5841;
      if ((pIVar68->IO).FontAllowUserScaling == true) {
        if (pIVar51 != pIVar59) {
          pIVar68->WheelingWindow = pIVar59;
          pIVar68->WheelingWindowRefMousePos = (pIVar68->IO).MousePos;
          pIVar68->WheelingWindowTimer = 2.0;
        }
        fVar74 = pIVar59->FontWindowScale;
        auVar77 = vfmadd132ss_fma(auVar76,ZEXT416((uint)fVar74),ZEXT416(0x3dcccccd));
        auVar76 = vminss_avx(SUB6416(ZEXT464(0x40200000),0),auVar77);
        uVar36 = vcmpss_avx512f(auVar77,SUB6416(ZEXT464(0x3f000000),0),1);
        bVar71 = (bool)((byte)uVar36 & 1);
        fVar89 = (float)((uint)bVar71 * 0x3f000000 + (uint)!bVar71 * auVar76._0_4_);
        pIVar59->FontWindowScale = fVar89;
        if (pIVar59 == pIVar59->RootWindow) {
          fVar89 = fVar89 / fVar74;
          IVar10 = pIVar59->Pos;
          auVar137._8_8_ = 0;
          auVar137._0_4_ = IVar10.x;
          auVar137._4_4_ = IVar10.y;
          auVar133._8_8_ = 0;
          auVar133._0_4_ = (pIVar68->IO).MousePos.x;
          auVar133._4_4_ = (pIVar68->IO).MousePos.y;
          IVar17 = pIVar59->Size;
          auVar126._8_8_ = 0;
          auVar126._0_4_ = IVar17.x;
          auVar126._4_4_ = IVar17.y;
          auVar76 = vsubps_avx(auVar133,auVar137);
          fVar74 = 1.0 - fVar89;
          auVar108._0_4_ = fVar74 * IVar17.x * auVar76._0_4_;
          auVar108._4_4_ = fVar74 * IVar17.y * auVar76._4_4_;
          auVar108._8_4_ = fVar74 * 0.0 * auVar76._8_4_;
          auVar108._12_4_ = fVar74 * 0.0 * auVar76._12_4_;
          auVar76 = vdivps_avx(auVar108,auVar126);
          auVar109._0_4_ = IVar10.x + auVar76._0_4_;
          auVar109._4_4_ = IVar10.y + auVar76._4_4_;
          auVar109._8_4_ = auVar76._8_4_ + 0.0;
          auVar109._12_4_ = auVar76._12_4_ + 0.0;
          local_38 = (ImVec2)vmovlps_avx(auVar109);
          SetWindowPos(pIVar59,&local_38,0);
          auVar119._0_4_ = (int)(fVar89 * (pIVar59->Size).x);
          auVar119._4_4_ = (int)(fVar89 * (pIVar59->Size).y);
          auVar119._8_4_ = (int)(fVar89 * 0.0);
          auVar119._12_4_ = (int)(fVar89 * 0.0);
          auVar110._0_4_ = (int)(fVar89 * (pIVar59->SizeFull).x);
          auVar110._4_4_ = (int)(fVar89 * (pIVar59->SizeFull).y);
          auVar110._8_4_ = (int)(fVar89 * 0.0);
          auVar110._12_4_ = (int)(fVar89 * 0.0);
          auVar76 = vcvtdq2ps_avx(auVar119);
          auVar77 = vcvtdq2ps_avx(auVar110);
          auVar76 = vmovlhps_avx(auVar76,auVar77);
          (pIVar59->Size).x = (float)(int)auVar76._0_8_;
          (pIVar59->Size).y = (float)(int)((ulong)auVar76._0_8_ >> 0x20);
          (pIVar59->SizeFull).x = (float)(int)auVar76._8_8_;
          (pIVar59->SizeFull).y = (float)(int)((ulong)auVar76._8_8_ >> 0x20);
        }
      }
    }
    else if ((bVar71 & 1U) == 0) {
LAB_002b5841:
      if (((pIVar68->IO).KeyShift != true) ||
         (auVar77 = auVar76, (pIVar68->IO).ConfigMacOSXBehaviors == true)) {
        auVar77 = ZEXT416((uint)(pIVar68->IO).MouseWheelH);
        if ((fVar74 != 0.0) || (NAN(fVar74))) {
          if (pIVar51 != pIVar59) {
            pIVar68->WheelingWindow = pIVar59;
            pIVar68->WheelingWindowRefMousePos = (pIVar68->IO).MousePos;
            pIVar68->WheelingWindowTimer = 2.0;
            pIVar51 = pIVar59;
          }
          uVar47 = pIVar59->Flags;
          while (((uVar47 >> 0x18 & 1) != 0 &&
                 (((uVar47 & 0x210) == 0x10 ||
                  ((fVar74 = (pIVar59->ScrollMax).y, fVar74 == 0.0 && (!NAN(fVar74)))))))) {
            pIVar59 = pIVar59->ParentWindow;
            uVar47 = pIVar59->Flags;
          }
          if ((uVar47 & 0x210) == 0) {
            fVar74 = pIVar68->FontBaseSize * pIVar59->FontWindowScale;
            if (pIVar59->ParentWindow != (ImGuiWindow *)0x0) {
              fVar74 = fVar74 * pIVar59->ParentWindow->FontWindowScale;
            }
            auVar75 = vminss_avx(ZEXT416((uint)(fVar74 * 5.0)),
                                 ZEXT416((uint)(((pIVar59->InnerRect).Max.y -
                                                (pIVar59->InnerRect).Min.y) * 0.67)));
            auVar127._0_4_ = (int)auVar75._0_4_;
            auVar127._4_4_ = (int)auVar75._4_4_;
            auVar127._8_4_ = (int)auVar75._8_4_;
            auVar127._12_4_ = (int)auVar75._12_4_;
            auVar75 = vcvtdq2ps_avx(auVar127);
            auVar76 = vfnmadd213ss_fma(auVar75,auVar76,ZEXT416((uint)(pIVar59->Scroll).y));
            (pIVar59->ScrollTarget).y = auVar76._0_4_;
            (pIVar59->ScrollTargetCenterRatio).y = 0.0;
            (pIVar59->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      if ((auVar77._0_4_ != 0.0) || (NAN(auVar77._0_4_))) {
        if (pIVar51 != pIVar59) {
          pIVar68->WheelingWindow = pIVar59;
          pIVar68->WheelingWindowRefMousePos = (pIVar68->IO).MousePos;
          pIVar68->WheelingWindowTimer = 2.0;
        }
        while ((uVar47 = pIVar59->Flags, (uVar47 >> 0x18 & 1) != 0 &&
               (((uVar47 & 0x210) == 0x10 ||
                ((fVar74 = (pIVar59->ScrollMax).x, fVar74 == 0.0 && (!NAN(fVar74)))))))) {
          pIVar59 = pIVar59->ParentWindow;
        }
        if ((uVar47 & 0x210) == 0) {
          fVar74 = pIVar68->FontBaseSize * pIVar59->FontWindowScale;
          if (pIVar59->ParentWindow != (ImGuiWindow *)0x0) {
            fVar74 = fVar74 * pIVar59->ParentWindow->FontWindowScale;
          }
          auVar76 = vminss_avx(ZEXT416((uint)(fVar74 + fVar74)),
                               ZEXT416((uint)(((pIVar59->InnerRect).Max.x -
                                              (pIVar59->InnerRect).Min.x) * 0.67)));
          auVar120._0_4_ = (int)auVar76._0_4_;
          auVar120._4_4_ = (int)auVar76._4_4_;
          auVar120._8_4_ = (int)auVar76._8_4_;
          auVar120._12_4_ = (int)auVar76._12_4_;
          auVar76 = vcvtdq2ps_avx(auVar120);
          auVar76 = vfnmadd213ss_fma(auVar76,auVar77,ZEXT416((uint)(pIVar59->Scroll).x));
          (pIVar59->ScrollTarget).x = auVar76._0_4_;
          (pIVar59->ScrollTargetCenterRatio).x = 0.0;
          (pIVar59->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  if ((pIVar43->GcCompactAll == false) &&
     (fVar74 = (pIVar43->IO).ConfigMemoryCompactTimer, 0.0 <= fVar74)) {
    fVar88 = (float)pIVar43->Time - fVar74;
  }
  uVar47 = (pIVar43->Windows).Size;
  if (uVar47 != 0) {
    uVar50 = 0;
    do {
      pIVar51 = (pIVar43->Windows).Data[uVar50];
      bVar71 = pIVar51->Active;
      pIVar51->WasActive = bVar71;
      pIVar51->BeginCount = 0;
      pIVar51->Active = false;
      pIVar51->WriteAccessed = false;
      if (((bVar71 == false) && (pIVar51->MemoryCompacted == false)) &&
         (pIVar51->LastTimeActive < fVar88)) {
        GcCompactTransientWindowBuffers(pIVar51);
        uVar47 = (pIVar43->Windows).Size;
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 != uVar47);
  }
  iVar61 = (pIVar43->TablesLastTimeActive).Size;
  if (0 < iVar61) {
    lVar65 = 0;
    lVar64 = 0;
    do {
      fVar74 = (pIVar43->TablesLastTimeActive).Data[lVar64];
      if ((0.0 <= fVar74) && (fVar74 < fVar88)) {
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar43->Tables).Buf.Data)->ID + lVar65));
        iVar61 = (pIVar43->TablesLastTimeActive).Size;
      }
      lVar64 = lVar64 + 1;
      lVar65 = lVar65 + 0x208;
    } while (lVar64 < iVar61);
  }
  iVar61 = (pIVar43->TablesTempData).Size;
  if (0 < iVar61) {
    lVar65 = 0;
    lVar64 = 0;
    do {
      pIVar19 = (pIVar43->TablesTempData).Data;
      fVar74 = *(float *)((long)&pIVar19->LastTimeActive + lVar65);
      if ((0.0 <= fVar74) && (fVar74 < fVar88)) {
        TableGcCompactTransientBuffers((ImGuiTableTempData *)((long)&pIVar19->TableIndex + lVar65));
        iVar61 = (pIVar43->TablesTempData).Size;
      }
      lVar64 = lVar64 + 1;
      lVar65 = lVar65 + 0x70;
    } while (lVar64 < iVar61);
  }
  if (pIVar43->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar43->GcCompactAll = false;
  if ((pIVar43->NavWindow != (ImGuiWindow *)0x0) && (pIVar43->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((pIVar43->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar54 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar54 = *piVar54 + 1;
    }
    __dest_00 = (ImGuiWindowStackData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar20 = (pIVar43->CurrentWindowStack).Data;
    if (pIVar20 != (ImGuiWindowStackData *)0x0) {
      memcpy(__dest_00,pIVar20,(long)(pIVar43->CurrentWindowStack).Size * 0x58);
      pIVar20 = (pIVar43->CurrentWindowStack).Data;
      if ((pIVar20 != (ImGuiWindowStackData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar54 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar54 = *piVar54 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar20,GImAllocatorUserData);
    }
    (pIVar43->CurrentWindowStack).Data = __dest_00;
    (pIVar43->CurrentWindowStack).Capacity = 0;
  }
  (pIVar43->CurrentWindowStack).Size = 0;
  if ((pIVar43->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar54 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar54 = *piVar54 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar21 = (pIVar43->BeginPopupStack).Data;
    if (pIVar21 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar21,(long)(pIVar43->BeginPopupStack).Size * 0x30);
      pIVar21 = (pIVar43->BeginPopupStack).Data;
      if ((pIVar21 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar54 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar54 = *piVar54 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar21,GImAllocatorUserData);
    }
    (pIVar43->BeginPopupStack).Data = __dest_01;
    (pIVar43->BeginPopupStack).Capacity = 0;
  }
  (pIVar43->BeginPopupStack).Size = 0;
  iVar61 = (pIVar43->ItemFlagsStack).Capacity;
  if (iVar61 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar54 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar54 = *piVar54 + 1;
    }
    piVar53 = (int *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    piVar54 = (pIVar43->ItemFlagsStack).Data;
    if (piVar54 != (int *)0x0) {
      memcpy(piVar53,piVar54,(long)(pIVar43->ItemFlagsStack).Size << 2);
      piVar54 = (pIVar43->ItemFlagsStack).Data;
      if ((piVar54 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar54,GImAllocatorUserData);
    }
    (pIVar43->ItemFlagsStack).Data = piVar53;
    (pIVar43->ItemFlagsStack).Size = 0;
    (pIVar43->ItemFlagsStack).Capacity = 0;
  }
  else {
    (pIVar43->ItemFlagsStack).Size = 0;
    if (iVar61 != 0) {
      piVar54 = (pIVar43->ItemFlagsStack).Data;
      lVar65 = 0;
      goto LAB_002b53b1;
    }
  }
  if (GImGui != (ImGuiContext *)0x0) {
    piVar54 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar54 = *piVar54 + 1;
  }
  piVar54 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
  piVar53 = (pIVar43->ItemFlagsStack).Data;
  if (piVar53 != (int *)0x0) {
    memcpy(piVar54,piVar53,(long)(pIVar43->ItemFlagsStack).Size << 2);
    piVar53 = (pIVar43->ItemFlagsStack).Data;
    if ((piVar53 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(piVar53,GImAllocatorUserData);
  }
  (pIVar43->ItemFlagsStack).Data = piVar54;
  (pIVar43->ItemFlagsStack).Capacity = 8;
  lVar65 = (long)(pIVar43->ItemFlagsStack).Size;
LAB_002b53b1:
  piVar54[lVar65] = 0;
  (pIVar43->ItemFlagsStack).Size = (pIVar43->ItemFlagsStack).Size + 1;
  if ((pIVar43->GroupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar54 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar54 = *piVar54 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar22 = (pIVar43->GroupStack).Data;
    if (pIVar22 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar22,(long)(pIVar43->GroupStack).Size * 0x30);
      pIVar22 = (pIVar43->GroupStack).Data;
      if ((pIVar22 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar54 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar54 = *piVar54 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar22,GImAllocatorUserData);
    }
    (pIVar43->GroupStack).Data = __dest_02;
    (pIVar43->GroupStack).Capacity = 0;
  }
  (pIVar43->GroupStack).Size = 0;
  pIVar68 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar68->DebugItemPickerActive == true) {
    uVar47 = pIVar68->HoveredIdPreviousFrame;
    pIVar68->MouseCursor = 7;
    iVar61 = (pIVar68->IO).KeyMap[0xe];
    if ((-1 < iVar61) && (bVar71 = IsKeyPressed(iVar61,true), bVar71)) {
      pIVar68->DebugItemPickerActive = false;
    }
    fVar88 = (pIVar68->IO).MouseDownDuration[0];
    if ((fVar88 != 0.0) || (NAN(fVar88))) {
      uVar49 = (uint)(uVar47 == 0);
    }
    else if (uVar47 == 0) {
      uVar49 = 1;
    }
    else {
      pIVar68->DebugItemPickerBreakId = uVar47;
      uVar49 = 0;
      pIVar68->DebugItemPickerActive = false;
    }
    *(byte *)&(pIVar68->NextWindowData).Flags = (byte)(pIVar68->NextWindowData).Flags | 0x40;
    (pIVar68->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar47);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar49 << 4)),
                "Click to break in debugger!");
    End();
    pIVar68 = GImGui;
  }
  pIVar68->DebugHookIdInfo = 0;
  if (pIVar68->FrameCount == (pIVar68->DebugStackTool).LastActiveFrame + 1) {
    IVar56 = pIVar68->HoveredIdPreviousFrame;
    if (IVar56 == 0) {
      IVar56 = pIVar68->ActiveId;
    }
    if ((pIVar68->DebugStackTool).QueryId != IVar56) {
      (pIVar68->DebugStackTool).QueryId = IVar56;
      (pIVar68->DebugStackTool).StackLevel = -1;
      if ((pIVar68->DebugStackTool).Results.Capacity < 0) {
        piVar54 = &(pIVar68->IO).MetricsActiveAllocations;
        *piVar54 = *piVar54 + 1;
        __dest_03 = (ImGuiStackLevelInfo *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
        pIVar23 = (pIVar68->DebugStackTool).Results.Data;
        if (pIVar23 != (ImGuiStackLevelInfo *)0x0) {
          memcpy(__dest_03,pIVar23,(long)(pIVar68->DebugStackTool).Results.Size << 6);
          pIVar23 = (pIVar68->DebugStackTool).Results.Data;
          if ((pIVar23 != (ImGuiStackLevelInfo *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar54 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar54 = *piVar54 + -1;
          }
          (*GImAllocatorFreeFunc)(pIVar23,GImAllocatorUserData);
        }
        (pIVar68->DebugStackTool).Results.Data = __dest_03;
        (pIVar68->DebugStackTool).Results.Capacity = 0;
      }
      (pIVar68->DebugStackTool).Results.Size = 0;
    }
    if (IVar56 != 0) {
      uVar47 = (pIVar68->DebugStackTool).StackLevel;
      lVar65 = (long)(int)uVar47;
      if (lVar65 < 0) {
        if (uVar47 == 0xffffffff) {
          pIVar68->DebugHookIdInfo = IVar56;
        }
      }
      else {
        iVar61 = (pIVar68->DebugStackTool).Results.Size;
        if (((int)uVar47 < iVar61) &&
           ((pIVar23 = (pIVar68->DebugStackTool).Results.Data, pIVar23[lVar65].QuerySuccess != false
            || ('\x02' < pIVar23[lVar65].QueryFrameCount)))) {
          uVar47 = uVar47 + 1;
          (pIVar68->DebugStackTool).StackLevel = uVar47;
        }
        if ((int)uVar47 < iVar61) {
          pIVar23 = (pIVar68->DebugStackTool).Results.Data;
          pIVar68->DebugHookIdInfo = pIVar23[uVar47].ID;
          pIVar3 = &pIVar23[uVar47].QueryFrameCount;
          *pIVar3 = *pIVar3 + '\x01';
        }
      }
    }
  }
  pIVar43->WithinFrameScopeWithImplicitWindow = true;
  pIVar68 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar68->NextWindowData).SizeVal.x = 400.0;
  (pIVar68->NextWindowData).SizeVal.y = 400.0;
  (pIVar68->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  iVar61 = (pIVar43->Hooks).Size;
  if (0 < iVar61) {
    lVar65 = 0;
    lVar64 = 0;
    do {
      pIVar13 = (pIVar43->Hooks).Data;
      if (*(int *)(pIVar13 + lVar65 + 4) == 1) {
        (**(code **)(pIVar13 + lVar65 + 0x10))(pIVar43,pIVar13 + lVar65);
        iVar61 = (pIVar43->Hooks).Size;
      }
      lVar64 = lVar64 + 1;
      lVar65 = lVar65 + 0x20;
    } while (lVar64 < iVar61);
  }
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Clear buttons state when focus is lost
    // (this is useful so e.g. releasing Alt after focus loss on Alt-Tab doesn't trigger the Alt menu toggle)
    if (g.IO.AppFocusLost)
    {
        g.IO.ClearInputKeys();
        g.IO.AppFocusLost = false;
    }

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}